

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  ulong uVar60;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar61;
  byte bVar62;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ulong uVar63;
  byte bVar64;
  undefined8 unaff_R13;
  ulong uVar65;
  bool bVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar138;
  uint uVar139;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  uint uVar140;
  uint uVar144;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar137 [64];
  float pp;
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar175 [16];
  undefined1 auVar180 [32];
  float fVar181;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar202;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar221;
  float fVar222;
  undefined1 auVar217 [32];
  float fVar223;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar229 [16];
  undefined1 auVar231 [32];
  undefined1 auVar230 [16];
  undefined1 auVar232 [32];
  float fVar235;
  undefined1 auVar233 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar234 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar243;
  float fVar250;
  undefined1 auVar246 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar248;
  float fVar249;
  undefined1 auVar247 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  float s;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_d0c;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar133 [64];
  undefined1 auVar136 [64];
  undefined1 auVar155 [32];
  
  uVar60 = (ulong)(byte)prim[1];
  fVar223 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar74 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar75 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  fVar201 = fVar223 * auVar75._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar60 * 4 + 6);
  auVar84 = vpmovsxbd_avx2(auVar12);
  fVar145 = fVar223 * auVar74._0_4_;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar60 * 5 + 6);
  auVar82 = vpmovsxbd_avx2(auVar13);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar60 * 6 + 6);
  auVar85 = vpmovsxbd_avx2(auVar69);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar86 = vpmovsxbd_avx2(auVar71);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar60 * 0xc + 6);
  auVar87 = vpmovsxbd_avx2(auVar1);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar83 = vpmovsxbd_avx2(auVar70);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar88 = vpmovsxbd_avx2(auVar78);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar60 * 0x13 + 6);
  auVar89 = vpmovsxbd_avx2(auVar72);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar60 * 0x14 + 6);
  auVar91 = vpmovsxbd_avx2(auVar73);
  auVar90 = vcvtdq2ps_avx(auVar91);
  auVar102._8_4_ = 1;
  auVar102._0_8_ = 0x100000001;
  auVar102._12_4_ = 1;
  auVar102._16_4_ = 1;
  auVar102._20_4_ = 1;
  auVar102._24_4_ = 1;
  auVar102._28_4_ = 1;
  auVar100._4_4_ = fVar145;
  auVar100._0_4_ = fVar145;
  auVar100._8_4_ = fVar145;
  auVar100._12_4_ = fVar145;
  auVar100._16_4_ = fVar145;
  auVar100._20_4_ = fVar145;
  auVar100._24_4_ = fVar145;
  auVar100._28_4_ = fVar145;
  auVar81 = ZEXT1632(CONCAT412(fVar223 * auVar74._12_4_,
                               CONCAT48(fVar223 * auVar74._8_4_,
                                        CONCAT44(fVar223 * auVar74._4_4_,fVar145))));
  auVar92 = vpermps_avx2(auVar102,auVar81);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar80 = vpermps_avx512vl(auVar79,auVar81);
  fVar145 = auVar80._0_4_;
  auVar163._0_4_ = fVar145 * auVar85._0_4_;
  fVar202 = auVar80._4_4_;
  auVar163._4_4_ = fVar202 * auVar85._4_4_;
  fVar218 = auVar80._8_4_;
  auVar163._8_4_ = fVar218 * auVar85._8_4_;
  fVar219 = auVar80._12_4_;
  auVar163._12_4_ = fVar219 * auVar85._12_4_;
  fVar220 = auVar80._16_4_;
  auVar163._16_4_ = fVar220 * auVar85._16_4_;
  fVar221 = auVar80._20_4_;
  auVar163._20_4_ = fVar221 * auVar85._20_4_;
  fVar222 = auVar80._24_4_;
  auVar163._28_36_ = in_ZMM4._28_36_;
  auVar163._24_4_ = fVar222 * auVar85._24_4_;
  auVar81._4_4_ = auVar83._4_4_ * fVar202;
  auVar81._0_4_ = auVar83._0_4_ * fVar145;
  auVar81._8_4_ = auVar83._8_4_ * fVar218;
  auVar81._12_4_ = auVar83._12_4_ * fVar219;
  auVar81._16_4_ = auVar83._16_4_ * fVar220;
  auVar81._20_4_ = auVar83._20_4_ * fVar221;
  auVar81._24_4_ = auVar83._24_4_ * fVar222;
  auVar81._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = fVar202 * auVar90._4_4_;
  auVar91._0_4_ = fVar145 * auVar90._0_4_;
  auVar91._8_4_ = fVar218 * auVar90._8_4_;
  auVar91._12_4_ = fVar219 * auVar90._12_4_;
  auVar91._16_4_ = fVar220 * auVar90._16_4_;
  auVar91._20_4_ = fVar221 * auVar90._20_4_;
  auVar91._24_4_ = fVar222 * auVar90._24_4_;
  auVar91._28_4_ = auVar80._28_4_;
  auVar12 = vfmadd231ps_fma(auVar163._0_32_,auVar92,auVar82);
  auVar13 = vfmadd231ps_fma(auVar81,auVar92,auVar87);
  auVar69 = vfmadd231ps_fma(auVar91,auVar89,auVar92);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar100,auVar84);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar100,auVar86);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar88,auVar100);
  auVar101._4_4_ = fVar201;
  auVar101._0_4_ = fVar201;
  auVar101._8_4_ = fVar201;
  auVar101._12_4_ = fVar201;
  auVar101._16_4_ = fVar201;
  auVar101._20_4_ = fVar201;
  auVar101._24_4_ = fVar201;
  auVar101._28_4_ = fVar201;
  auVar92 = ZEXT1632(CONCAT412(fVar223 * auVar75._12_4_,
                               CONCAT48(fVar223 * auVar75._8_4_,
                                        CONCAT44(fVar223 * auVar75._4_4_,fVar201))));
  auVar91 = vpermps_avx2(auVar102,auVar92);
  auVar81 = vpermps_avx512vl(auVar79,auVar92);
  fVar223 = auVar81._0_4_;
  fVar145 = auVar81._4_4_;
  auVar92._4_4_ = fVar145 * auVar85._4_4_;
  auVar92._0_4_ = fVar223 * auVar85._0_4_;
  fVar202 = auVar81._8_4_;
  auVar92._8_4_ = fVar202 * auVar85._8_4_;
  fVar218 = auVar81._12_4_;
  auVar92._12_4_ = fVar218 * auVar85._12_4_;
  fVar219 = auVar81._16_4_;
  auVar92._16_4_ = fVar219 * auVar85._16_4_;
  fVar220 = auVar81._20_4_;
  auVar92._20_4_ = fVar220 * auVar85._20_4_;
  fVar221 = auVar81._24_4_;
  auVar92._24_4_ = fVar221 * auVar85._24_4_;
  auVar92._28_4_ = auVar85._28_4_;
  auVar95._0_4_ = fVar223 * auVar83._0_4_;
  auVar95._4_4_ = fVar145 * auVar83._4_4_;
  auVar95._8_4_ = fVar202 * auVar83._8_4_;
  auVar95._12_4_ = fVar218 * auVar83._12_4_;
  auVar95._16_4_ = fVar219 * auVar83._16_4_;
  auVar95._20_4_ = fVar220 * auVar83._20_4_;
  auVar95._24_4_ = fVar221 * auVar83._24_4_;
  auVar95._28_4_ = 0;
  auVar83._4_4_ = fVar145 * auVar90._4_4_;
  auVar83._0_4_ = fVar223 * auVar90._0_4_;
  auVar83._8_4_ = fVar202 * auVar90._8_4_;
  auVar83._12_4_ = fVar218 * auVar90._12_4_;
  auVar83._16_4_ = fVar219 * auVar90._16_4_;
  auVar83._20_4_ = fVar220 * auVar90._20_4_;
  auVar83._24_4_ = fVar221 * auVar90._24_4_;
  auVar83._28_4_ = auVar90._28_4_;
  auVar71 = vfmadd231ps_fma(auVar92,auVar91,auVar82);
  auVar1 = vfmadd231ps_fma(auVar95,auVar91,auVar87);
  auVar70 = vfmadd231ps_fma(auVar83,auVar91,auVar89);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar101,auVar84);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar101,auVar86);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar101,auVar88);
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  auVar99._8_4_ = 0x219392ef;
  auVar99._0_8_ = 0x219392ef219392ef;
  auVar99._12_4_ = 0x219392ef;
  auVar99._16_4_ = 0x219392ef;
  auVar99._20_4_ = 0x219392ef;
  auVar99._24_4_ = 0x219392ef;
  auVar99._28_4_ = 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar12),auVar97);
  uVar65 = vcmpps_avx512vl(auVar84,auVar99,1);
  bVar66 = (bool)((byte)uVar65 & 1);
  auVar79._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._0_4_;
  bVar66 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._4_4_;
  bVar66 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._8_4_;
  bVar66 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar13),auVar97);
  uVar65 = vcmpps_avx512vl(auVar84,auVar99,1);
  bVar66 = (bool)((byte)uVar65 & 1);
  auVar80._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._0_4_;
  bVar66 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._4_4_;
  bVar66 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._8_4_;
  bVar66 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar69),auVar97);
  uVar65 = vcmpps_avx512vl(auVar84,auVar99,1);
  bVar66 = (bool)((byte)uVar65 & 1);
  auVar84._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar69._0_4_;
  bVar66 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar69._4_4_;
  bVar66 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar69._8_4_;
  bVar66 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar69._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar82 = vrcp14ps_avx512vl(auVar79);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar98._16_4_ = 0x3f800000;
  auVar98._20_4_ = 0x3f800000;
  auVar98._24_4_ = 0x3f800000;
  auVar98._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar79,auVar82,auVar98);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar80);
  auVar13 = vfnmadd213ps_fma(auVar80,auVar82,auVar98);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar84);
  auVar69 = vfnmadd213ps_fma(auVar84,auVar82,auVar98);
  auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar82,auVar82);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 7 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar71));
  auVar88._4_4_ = auVar12._4_4_ * auVar84._4_4_;
  auVar88._0_4_ = auVar12._0_4_ * auVar84._0_4_;
  auVar88._8_4_ = auVar12._8_4_ * auVar84._8_4_;
  auVar88._12_4_ = auVar12._12_4_ * auVar84._12_4_;
  auVar88._16_4_ = auVar84._16_4_ * 0.0;
  auVar88._20_4_ = auVar84._20_4_ * 0.0;
  auVar88._24_4_ = auVar84._24_4_ * 0.0;
  auVar88._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 9 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar71));
  auVar96._0_4_ = auVar12._0_4_ * auVar84._0_4_;
  auVar96._4_4_ = auVar12._4_4_ * auVar84._4_4_;
  auVar96._8_4_ = auVar12._8_4_ * auVar84._8_4_;
  auVar96._12_4_ = auVar12._12_4_ * auVar84._12_4_;
  auVar96._16_4_ = auVar84._16_4_ * 0.0;
  auVar96._20_4_ = auVar84._20_4_ * 0.0;
  auVar96._24_4_ = auVar84._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0xe + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar1));
  auVar89._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar89._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar89._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar89._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar89._16_4_ = auVar84._16_4_ * 0.0;
  auVar89._20_4_ = auVar84._20_4_ * 0.0;
  auVar89._24_4_ = auVar84._24_4_ * 0.0;
  auVar89._28_4_ = auVar84._28_4_;
  auVar83 = vpbroadcastd_avx512vl();
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar1));
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x15 + 6));
  auVar94._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar94._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar94._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar94._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar94._16_4_ = auVar84._16_4_ * 0.0;
  auVar94._20_4_ = auVar84._20_4_ * 0.0;
  auVar94._24_4_ = auVar84._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar84 = vcvtdq2ps_avx(auVar82);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar70));
  auVar90._4_4_ = auVar84._4_4_ * auVar69._4_4_;
  auVar90._0_4_ = auVar84._0_4_ * auVar69._0_4_;
  auVar90._8_4_ = auVar84._8_4_ * auVar69._8_4_;
  auVar90._12_4_ = auVar84._12_4_ * auVar69._12_4_;
  auVar90._16_4_ = auVar84._16_4_ * 0.0;
  auVar90._20_4_ = auVar84._20_4_ * 0.0;
  auVar90._24_4_ = auVar84._24_4_ * 0.0;
  auVar90._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x17 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar70));
  auVar93._0_4_ = auVar69._0_4_ * auVar84._0_4_;
  auVar93._4_4_ = auVar69._4_4_ * auVar84._4_4_;
  auVar93._8_4_ = auVar69._8_4_ * auVar84._8_4_;
  auVar93._12_4_ = auVar69._12_4_ * auVar84._12_4_;
  auVar93._16_4_ = auVar84._16_4_ * 0.0;
  auVar93._20_4_ = auVar84._20_4_ * 0.0;
  auVar93._24_4_ = auVar84._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar84 = vpminsd_avx2(auVar88,auVar96);
  auVar82 = vpminsd_avx2(auVar89,auVar94);
  auVar84 = vmaxps_avx(auVar84,auVar82);
  auVar82 = vpminsd_avx2(auVar90,auVar93);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar85._4_4_ = uVar164;
  auVar85._0_4_ = uVar164;
  auVar85._8_4_ = uVar164;
  auVar85._12_4_ = uVar164;
  auVar85._16_4_ = uVar164;
  auVar85._20_4_ = uVar164;
  auVar85._24_4_ = uVar164;
  auVar85._28_4_ = uVar164;
  auVar82 = vmaxps_avx512vl(auVar82,auVar85);
  auVar84 = vmaxps_avx(auVar84,auVar82);
  auVar82._8_4_ = 0x3f7ffffa;
  auVar82._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar82._12_4_ = 0x3f7ffffa;
  auVar82._16_4_ = 0x3f7ffffa;
  auVar82._20_4_ = 0x3f7ffffa;
  auVar82._24_4_ = 0x3f7ffffa;
  auVar82._28_4_ = 0x3f7ffffa;
  local_680 = vmulps_avx512vl(auVar84,auVar82);
  auVar84 = vpmaxsd_avx2(auVar88,auVar96);
  auVar82 = vpmaxsd_avx2(auVar89,auVar94);
  auVar84 = vminps_avx(auVar84,auVar82);
  auVar82 = vpmaxsd_avx2(auVar90,auVar93);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar86._4_4_ = uVar164;
  auVar86._0_4_ = uVar164;
  auVar86._8_4_ = uVar164;
  auVar86._12_4_ = uVar164;
  auVar86._16_4_ = uVar164;
  auVar86._20_4_ = uVar164;
  auVar86._24_4_ = uVar164;
  auVar86._28_4_ = uVar164;
  auVar82 = vminps_avx512vl(auVar82,auVar86);
  auVar84 = vminps_avx(auVar84,auVar82);
  auVar87._8_4_ = 0x3f800003;
  auVar87._0_8_ = 0x3f8000033f800003;
  auVar87._12_4_ = 0x3f800003;
  auVar87._16_4_ = 0x3f800003;
  auVar87._20_4_ = 0x3f800003;
  auVar87._24_4_ = 0x3f800003;
  auVar87._28_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar87);
  uVar14 = vcmpps_avx512vl(local_680,auVar84,2);
  uVar16 = vpcmpgtd_avx512vl(auVar83,_DAT_01fb4ba0);
  uVar65 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar14 & (byte)uVar16));
  auVar163 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar163);
LAB_01a4b5f3:
  if (uVar65 == 0) {
LAB_01a4e01e:
    return uVar65 != 0;
  }
  lVar18 = 0;
  for (uVar60 = uVar65; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  uVar2 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar18 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar18 = *(long *)&pGVar3[1].time_range.upper;
  auVar12 = *(undefined1 (*) [16])(lVar18 + (long)p_Var4 * uVar60);
  auVar13 = *(undefined1 (*) [16])(lVar18 + (uVar60 + 1) * (long)p_Var4);
  local_908 = uVar65 - 1 & uVar65;
  if (local_908 != 0) {
    uVar63 = local_908 - 1 & local_908;
    for (uVar67 = local_908; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    }
    if (uVar63 != 0) {
      for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar71 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar254._4_4_ = uVar164;
  auVar254._0_4_ = uVar164;
  auVar254._8_4_ = uVar164;
  auVar254._12_4_ = uVar164;
  local_840._16_4_ = uVar164;
  local_840._0_16_ = auVar254;
  local_840._20_4_ = uVar164;
  local_840._24_4_ = uVar164;
  local_840._28_4_ = uVar164;
  uVar164 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar77._4_4_ = uVar164;
  auVar77._0_4_ = uVar164;
  auVar77._8_4_ = uVar164;
  auVar77._12_4_ = uVar164;
  local_860._16_4_ = uVar164;
  local_860._0_16_ = auVar77;
  local_860._20_4_ = uVar164;
  local_860._24_4_ = uVar164;
  local_860._28_4_ = uVar164;
  auVar69 = vunpcklps_avx(auVar254,auVar77);
  fVar223 = *(float *)(ray + k * 4 + 0x180);
  auVar259._4_4_ = fVar223;
  auVar259._0_4_ = fVar223;
  auVar259._8_4_ = fVar223;
  auVar259._12_4_ = fVar223;
  local_880._16_4_ = fVar223;
  local_880._0_16_ = auVar259;
  local_880._20_4_ = fVar223;
  local_880._24_4_ = fVar223;
  local_880._28_4_ = fVar223;
  local_9f0 = vinsertps_avx(auVar69,auVar259,0x28);
  auVar75._0_4_ = auVar12._0_4_ + auVar13._0_4_;
  auVar75._4_4_ = auVar12._4_4_ + auVar13._4_4_;
  auVar75._8_4_ = auVar12._8_4_ + auVar13._8_4_;
  auVar75._12_4_ = auVar12._12_4_ + auVar13._12_4_;
  auVar74._8_4_ = 0x3f000000;
  auVar74._0_8_ = 0x3f0000003f000000;
  auVar74._12_4_ = 0x3f000000;
  auVar69 = vmulps_avx512vl(auVar75,auVar74);
  auVar69 = vsubps_avx(auVar69,auVar71);
  auVar69 = vdpps_avx(auVar69,local_9f0,0x7f);
  fVar145 = *(float *)(ray + k * 4 + 0xc0);
  auVar251 = ZEXT464((uint)fVar145);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar253 = ZEXT1664(local_a00);
  auVar76._4_12_ = ZEXT812(0) << 0x20;
  auVar76._0_4_ = local_a00._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar76);
  auVar1 = vfnmadd213ss_fma(auVar70,local_a00,ZEXT416(0x40000000));
  local_660 = auVar69._0_4_ * auVar70._0_4_ * auVar1._0_4_;
  auVar233._4_4_ = local_660;
  auVar233._0_4_ = local_660;
  auVar233._8_4_ = local_660;
  auVar233._12_4_ = local_660;
  fStack_810 = local_660;
  _local_820 = auVar233;
  fStack_80c = local_660;
  fStack_808 = local_660;
  fStack_804 = local_660;
  auVar69 = vfmadd231ps_fma(auVar71,local_9f0,auVar233);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar12 = vsubps_avx(auVar12,auVar69);
  auVar71 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + (uVar60 + 2) * (long)p_Var4),auVar69);
  auVar242 = ZEXT1664(auVar71);
  auVar13 = vsubps_avx(auVar13,auVar69);
  auVar247 = ZEXT1664(auVar13);
  auVar69 = vsubps_avx(*(undefined1 (*) [16])(lVar18 + (uVar60 + 3) * (long)p_Var4),auVar69);
  auVar84 = vbroadcastss_avx512vl(auVar12);
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  local_980 = ZEXT1632(auVar12);
  auVar82 = vpermps_avx512vl(auVar104,local_980);
  auVar105._8_4_ = 2;
  auVar105._0_8_ = 0x200000002;
  auVar105._12_4_ = 2;
  auVar105._16_4_ = 2;
  auVar105._20_4_ = 2;
  auVar105._24_4_ = 2;
  auVar105._28_4_ = 2;
  auVar85 = vpermps_avx512vl(auVar105,local_980);
  auVar106._8_4_ = 3;
  auVar106._0_8_ = 0x300000003;
  auVar106._12_4_ = 3;
  auVar106._16_4_ = 3;
  auVar106._20_4_ = 3;
  auVar106._24_4_ = 3;
  auVar106._28_4_ = 3;
  auVar86 = vpermps_avx512vl(auVar106,local_980);
  auVar87 = vbroadcastss_avx512vl(auVar13);
  local_9c0 = ZEXT1632(auVar13);
  auVar83 = vpermps_avx512vl(auVar104,local_9c0);
  auVar88 = vpermps_avx512vl(auVar105,local_9c0);
  auVar89 = vpermps_avx512vl(auVar106,local_9c0);
  auVar90 = vbroadcastss_avx512vl(auVar71);
  local_9a0 = ZEXT1632(auVar71);
  auVar91 = vpermps_avx512vl(auVar104,local_9a0);
  local_5c0 = vpermps_avx512vl(auVar105,local_9a0);
  local_5e0 = vpermps_avx512vl(auVar106,local_9a0);
  local_5a0 = vbroadcastss_avx512vl(auVar69);
  _local_9e0 = ZEXT1632(auVar69);
  local_620 = vpermps_avx2(auVar104,_local_9e0);
  local_560 = vpermps_avx2(auVar105,_local_9e0);
  local_640 = vpermps_avx2(auVar106,_local_9e0);
  auVar12 = vfmadd231ps_fma(ZEXT432((uint)(fVar223 * fVar223)),local_860,local_860);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_840,local_840);
  local_580._0_4_ = auVar12._0_4_;
  local_580._4_4_ = local_580._0_4_;
  local_580._8_4_ = local_580._0_4_;
  local_580._12_4_ = local_580._0_4_;
  local_580._16_4_ = local_580._0_4_;
  local_580._20_4_ = local_580._0_4_;
  local_580._24_4_ = local_580._0_4_;
  local_580._28_4_ = local_580._0_4_;
  auVar103._8_4_ = 0x7fffffff;
  auVar103._0_8_ = 0x7fffffff7fffffff;
  auVar103._12_4_ = 0x7fffffff;
  auVar103._16_4_ = 0x7fffffff;
  auVar103._20_4_ = 0x7fffffff;
  auVar103._24_4_ = 0x7fffffff;
  auVar103._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_580,auVar103);
  local_950 = ZEXT416((uint)local_660);
  local_660 = fVar145 - local_660;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar163 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar163);
  uVar60 = 0;
  bVar59 = 0;
  local_d0c = 1;
  auVar163 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar163);
  auVar12 = vsqrtss_avx(local_a00,local_a00);
  auVar13 = vsqrtss_avx(local_a00,local_a00);
  local_710 = ZEXT816(0x3f80000000000000);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar260 = ZEXT3264(auVar92);
  auVar163 = ZEXT3264(_DAT_01f7b040);
  local_600 = local_5a0;
  do {
    auVar69 = vmovshdup_avx(local_710);
    auVar69 = vsubps_avx(auVar69,local_710);
    auVar146._0_4_ = auVar69._0_4_;
    fVar223 = auVar146._0_4_ * 0.04761905;
    uVar164 = local_710._0_4_;
    auVar226._4_4_ = uVar164;
    auVar226._0_4_ = uVar164;
    auVar226._8_4_ = uVar164;
    auVar226._12_4_ = uVar164;
    auVar226._16_4_ = uVar164;
    auVar226._20_4_ = uVar164;
    auVar226._24_4_ = uVar164;
    auVar226._28_4_ = uVar164;
    auVar146._4_4_ = auVar146._0_4_;
    auVar146._8_4_ = auVar146._0_4_;
    auVar146._12_4_ = auVar146._0_4_;
    auVar155._16_4_ = auVar146._0_4_;
    auVar155._0_16_ = auVar146;
    auVar155._20_4_ = auVar146._0_4_;
    auVar155._24_4_ = auVar146._0_4_;
    auVar155._28_4_ = auVar146._0_4_;
    auVar69 = vfmadd231ps_fma(auVar226,auVar155,auVar163._0_32_);
    auVar92 = vsubps_avx512vl(auVar260._0_32_,ZEXT1632(auVar69));
    fVar202 = auVar69._0_4_;
    fVar218 = auVar69._4_4_;
    fVar219 = auVar69._8_4_;
    fVar220 = auVar69._12_4_;
    fVar222 = auVar92._0_4_;
    fVar201 = auVar92._4_4_;
    fVar235 = auVar92._8_4_;
    fVar236 = auVar92._12_4_;
    fVar237 = auVar92._16_4_;
    fVar181 = auVar92._20_4_;
    fVar238 = auVar92._24_4_;
    auVar108._4_4_ = fVar201 * fVar201 * -fVar218;
    auVar108._0_4_ = fVar222 * fVar222 * -fVar202;
    auVar108._8_4_ = fVar235 * fVar235 * -fVar219;
    auVar108._12_4_ = fVar236 * fVar236 * -fVar220;
    auVar108._16_4_ = fVar237 * fVar237 * -0.0;
    auVar108._20_4_ = fVar181 * fVar181 * -0.0;
    auVar108._24_4_ = fVar238 * fVar238 * -0.0;
    auVar108._28_4_ = 0x80000000;
    auVar242._0_28_ =
         ZEXT1628(CONCAT412(fVar220 * fVar220,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar218 * fVar218,fVar202 * fVar202)
                                    )));
    fVar243 = fVar202 * 3.0;
    fVar248 = fVar218 * 3.0;
    fVar249 = fVar219 * 3.0;
    fVar250 = fVar220 * 3.0;
    auVar260._28_36_ = auVar247._28_36_;
    auVar260._0_28_ = ZEXT1628(CONCAT412(fVar250,CONCAT48(fVar249,CONCAT44(fVar248,fVar243))));
    auVar176._0_4_ = (fVar243 + -5.0) * fVar202 * fVar202;
    auVar176._4_4_ = (fVar248 + -5.0) * fVar218 * fVar218;
    auVar176._8_4_ = (fVar249 + -5.0) * fVar219 * fVar219;
    auVar176._12_4_ = (fVar250 + -5.0) * fVar220 * fVar220;
    auVar176._16_4_ = 0x80000000;
    auVar176._20_4_ = 0x80000000;
    auVar176._24_4_ = 0x80000000;
    auVar176._28_4_ = 0;
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar79 = vaddps_avx512vl(auVar176,auVar81);
    auVar252._0_4_ = fVar222 * fVar222;
    auVar252._4_4_ = fVar201 * fVar201;
    auVar252._8_4_ = fVar235 * fVar235;
    auVar252._12_4_ = fVar236 * fVar236;
    auVar252._16_4_ = fVar237 * fVar237;
    auVar252._20_4_ = fVar181 * fVar181;
    auVar252._28_36_ = auVar251._28_36_;
    auVar252._24_4_ = fVar238 * fVar238;
    auVar113._4_4_ = auVar252._4_4_ * (fVar201 * 3.0 + -5.0);
    auVar113._0_4_ = auVar252._0_4_ * (fVar222 * 3.0 + -5.0);
    auVar113._8_4_ = auVar252._8_4_ * (fVar235 * 3.0 + -5.0);
    auVar113._12_4_ = auVar252._12_4_ * (fVar236 * 3.0 + -5.0);
    auVar113._16_4_ = auVar252._16_4_ * (fVar237 * 3.0 + -5.0);
    auVar113._20_4_ = auVar252._20_4_ * (fVar181 * 3.0 + -5.0);
    auVar113._24_4_ = auVar252._24_4_ * (fVar238 * 3.0 + -5.0);
    auVar113._28_4_ = auVar253._28_4_ + -5.0;
    auVar80 = vaddps_avx512vl(auVar113,auVar81);
    fVar221 = auVar92._28_4_;
    auVar114._4_4_ = fVar218 * fVar218 * -fVar201;
    auVar114._0_4_ = fVar202 * fVar202 * -fVar222;
    auVar114._8_4_ = fVar219 * fVar219 * -fVar235;
    auVar114._12_4_ = fVar220 * fVar220 * -fVar236;
    auVar114._16_4_ = -fVar237 * 0.0 * 0.0;
    auVar114._20_4_ = -fVar181 * 0.0 * 0.0;
    auVar114._24_4_ = -fVar238 * 0.0 * 0.0;
    auVar114._28_4_ = -fVar221;
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar92 = vmulps_avx512vl(auVar108,auVar93);
    auVar94 = vmulps_avx512vl(auVar79,auVar93);
    auVar80 = vmulps_avx512vl(auVar80,auVar93);
    auVar95 = vmulps_avx512vl(auVar114,auVar93);
    auVar96 = vmulps_avx512vl(local_600,auVar95);
    auVar115._4_4_ = local_620._4_4_ * auVar95._4_4_;
    auVar115._0_4_ = local_620._0_4_ * auVar95._0_4_;
    auVar115._8_4_ = local_620._8_4_ * auVar95._8_4_;
    auVar115._12_4_ = local_620._12_4_ * auVar95._12_4_;
    auVar115._16_4_ = local_620._16_4_ * auVar95._16_4_;
    auVar115._20_4_ = local_620._20_4_ * auVar95._20_4_;
    auVar115._24_4_ = local_620._24_4_ * auVar95._24_4_;
    auVar115._28_4_ = auVar79._28_4_;
    auVar79 = vmulps_avx512vl(local_560,auVar95);
    auVar116._4_4_ = local_640._4_4_ * auVar95._4_4_;
    auVar116._0_4_ = local_640._0_4_ * auVar95._0_4_;
    auVar116._8_4_ = local_640._8_4_ * auVar95._8_4_;
    auVar116._12_4_ = local_640._12_4_ * auVar95._12_4_;
    auVar116._16_4_ = local_640._16_4_ * auVar95._16_4_;
    auVar116._20_4_ = local_640._20_4_ * auVar95._20_4_;
    auVar116._24_4_ = local_640._24_4_ * auVar95._24_4_;
    auVar116._28_4_ = auVar95._28_4_;
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar80,auVar90);
    auVar96 = vfmadd231ps_avx512vl(auVar115,auVar80,auVar91);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar80,local_5c0);
    auVar80 = vfmadd231ps_avx512vl(auVar116,local_5e0,auVar80);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar87);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar83);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar94,auVar88);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar89,auVar94);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar84);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar82);
    auVar97 = vfmadd231ps_avx512vl(auVar79,auVar92,auVar85);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar86,auVar92);
    auVar117._4_4_ = (fVar201 + fVar201) * fVar218;
    auVar117._0_4_ = (fVar222 + fVar222) * fVar202;
    auVar117._8_4_ = (fVar235 + fVar235) * fVar219;
    auVar117._12_4_ = (fVar236 + fVar236) * fVar220;
    auVar117._16_4_ = (fVar237 + fVar237) * 0.0;
    auVar117._20_4_ = (fVar181 + fVar181) * 0.0;
    auVar117._24_4_ = (fVar238 + fVar238) * 0.0;
    auVar117._28_4_ = auVar94._28_4_;
    auVar92 = vsubps_avx(auVar117,auVar252._0_32_);
    auVar227._0_28_ =
         ZEXT1628(CONCAT412((fVar220 + fVar220) * (fVar250 + -5.0) + fVar250 * fVar220,
                            CONCAT48((fVar219 + fVar219) * (fVar249 + -5.0) + fVar249 * fVar219,
                                     CONCAT44((fVar218 + fVar218) * (fVar248 + -5.0) +
                                              fVar248 * fVar218,
                                              (fVar202 + fVar202) * (fVar243 + -5.0) +
                                              fVar243 * fVar202))));
    auVar227._28_4_ = auVar247._28_4_ + -5.0 + 0.0;
    auVar81 = vaddps_avx512vl(auVar260._0_32_,auVar81);
    auVar120._4_4_ = (fVar201 + fVar201) * auVar81._4_4_;
    auVar120._0_4_ = (fVar222 + fVar222) * auVar81._0_4_;
    auVar120._8_4_ = (fVar235 + fVar235) * auVar81._8_4_;
    auVar120._12_4_ = (fVar236 + fVar236) * auVar81._12_4_;
    auVar120._16_4_ = (fVar237 + fVar237) * auVar81._16_4_;
    auVar120._20_4_ = (fVar181 + fVar181) * auVar81._20_4_;
    auVar120._24_4_ = (fVar238 + fVar238) * auVar81._24_4_;
    auVar120._28_4_ = auVar81._28_4_;
    auVar121._4_4_ = fVar201 * 3.0 * fVar201;
    auVar121._0_4_ = fVar222 * 3.0 * fVar222;
    auVar121._8_4_ = fVar235 * 3.0 * fVar235;
    auVar121._12_4_ = fVar236 * 3.0 * fVar236;
    auVar121._16_4_ = fVar237 * 3.0 * fVar237;
    auVar121._20_4_ = fVar181 * 3.0 * fVar181;
    auVar121._24_4_ = fVar238 * 3.0 * fVar238;
    auVar121._28_4_ = fVar221;
    auVar81 = vsubps_avx(auVar120,auVar121);
    auVar79 = vsubps_avx(auVar242._0_32_,auVar117);
    auVar98 = vmulps_avx512vl(auVar92,auVar93);
    auVar99 = vmulps_avx512vl(auVar227,auVar93);
    auVar81 = vmulps_avx512vl(auVar81,auVar93);
    auVar79 = vmulps_avx512vl(auVar79,auVar93);
    auVar93 = vmulps_avx512vl(local_600,auVar79);
    auVar122._4_4_ = local_620._4_4_ * auVar79._4_4_;
    auVar122._0_4_ = local_620._0_4_ * auVar79._0_4_;
    auVar122._8_4_ = local_620._8_4_ * auVar79._8_4_;
    auVar122._12_4_ = local_620._12_4_ * auVar79._12_4_;
    auVar122._16_4_ = local_620._16_4_ * auVar79._16_4_;
    auVar122._20_4_ = local_620._20_4_ * auVar79._20_4_;
    auVar122._24_4_ = local_620._24_4_ * auVar79._24_4_;
    auVar122._28_4_ = auVar92._28_4_;
    auVar92 = vmulps_avx512vl(local_560,auVar79);
    auVar35._4_4_ = local_640._4_4_ * auVar79._4_4_;
    auVar35._0_4_ = local_640._0_4_ * auVar79._0_4_;
    auVar35._8_4_ = local_640._8_4_ * auVar79._8_4_;
    auVar35._12_4_ = local_640._12_4_ * auVar79._12_4_;
    auVar35._16_4_ = local_640._16_4_ * auVar79._16_4_;
    auVar35._20_4_ = local_640._20_4_ * auVar79._20_4_;
    auVar35._24_4_ = local_640._24_4_ * auVar79._24_4_;
    auVar35._28_4_ = auVar79._28_4_;
    auVar79 = vfmadd231ps_avx512vl(auVar93,auVar81,auVar90);
    auVar93 = vfmadd231ps_avx512vl(auVar122,auVar81,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar81,local_5c0);
    auVar81 = vfmadd231ps_avx512vl(auVar35,local_5e0,auVar81);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar99,auVar87);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar83);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,auVar88);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar89,auVar99);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar98,auVar84);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar82);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar85);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar98);
    auVar36._4_4_ = auVar79._4_4_ * fVar223;
    auVar36._0_4_ = auVar79._0_4_ * fVar223;
    auVar36._8_4_ = auVar79._8_4_ * fVar223;
    auVar36._12_4_ = auVar79._12_4_ * fVar223;
    auVar36._16_4_ = auVar79._16_4_ * fVar223;
    auVar36._20_4_ = auVar79._20_4_ * fVar223;
    auVar36._24_4_ = auVar79._24_4_ * fVar223;
    auVar36._28_4_ = fVar221 + fVar221;
    auVar37._4_4_ = auVar93._4_4_ * fVar223;
    auVar37._0_4_ = auVar93._0_4_ * fVar223;
    auVar37._8_4_ = auVar93._8_4_ * fVar223;
    auVar37._12_4_ = auVar93._12_4_ * fVar223;
    auVar37._16_4_ = auVar93._16_4_ * fVar223;
    auVar37._20_4_ = auVar93._20_4_ * fVar223;
    auVar37._24_4_ = auVar93._24_4_ * fVar223;
    auVar37._28_4_ = auVar94._28_4_;
    auVar38._4_4_ = auVar92._4_4_ * fVar223;
    auVar38._0_4_ = auVar92._0_4_ * fVar223;
    auVar38._8_4_ = auVar92._8_4_ * fVar223;
    auVar38._12_4_ = auVar92._12_4_ * fVar223;
    auVar38._16_4_ = auVar92._16_4_ * fVar223;
    auVar38._20_4_ = auVar92._20_4_ * fVar223;
    auVar38._24_4_ = auVar92._24_4_ * fVar223;
    auVar38._28_4_ = 0;
    fVar202 = fVar223 * auVar81._0_4_;
    fVar218 = fVar223 * auVar81._4_4_;
    auVar39._4_4_ = fVar218;
    auVar39._0_4_ = fVar202;
    fVar219 = fVar223 * auVar81._8_4_;
    auVar39._8_4_ = fVar219;
    fVar220 = fVar223 * auVar81._12_4_;
    auVar39._12_4_ = fVar220;
    fVar221 = fVar223 * auVar81._16_4_;
    auVar39._16_4_ = fVar221;
    fVar222 = fVar223 * auVar81._20_4_;
    auVar39._20_4_ = fVar222;
    fVar201 = fVar223 * auVar81._24_4_;
    auVar39._24_4_ = fVar201;
    auVar39._28_4_ = fVar223;
    auVar69 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
    auVar94 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar98 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar251 = ZEXT3264(auVar98);
    auVar79 = ZEXT1632(auVar69);
    auVar99 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar79);
    auVar253 = ZEXT3264(auVar99);
    auVar228._0_4_ = auVar80._0_4_ + fVar202;
    auVar228._4_4_ = auVar80._4_4_ + fVar218;
    auVar228._8_4_ = auVar80._8_4_ + fVar219;
    auVar228._12_4_ = auVar80._12_4_ + fVar220;
    auVar228._16_4_ = auVar80._16_4_ + fVar221;
    auVar228._20_4_ = auVar80._20_4_ + fVar222;
    auVar228._24_4_ = auVar80._24_4_ + fVar201;
    auVar228._28_4_ = auVar80._28_4_ + fVar223;
    auVar92 = vmaxps_avx(auVar80,auVar228);
    auVar81 = vminps_avx(auVar80,auVar228);
    auVar100 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar79);
    auVar101 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9fc0,auVar79);
    auVar102 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar79);
    auVar116 = ZEXT1632(auVar69);
    auVar103 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar116);
    auVar79 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar116);
    auVar104 = vsubps_avx512vl(auVar100,auVar79);
    auVar79 = vsubps_avx(auVar94,auVar95);
    auVar247 = ZEXT3264(auVar79);
    auVar80 = vsubps_avx(auVar98,auVar96);
    auVar242 = ZEXT3264(auVar80);
    auVar93 = vsubps_avx(auVar99,auVar97);
    auVar105 = vmulps_avx512vl(auVar80,auVar38);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar37,auVar93);
    auVar106 = vmulps_avx512vl(auVar93,auVar36);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar38,auVar79);
    auVar107 = vmulps_avx512vl(auVar79,auVar37);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar36,auVar80);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar93,auVar93);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar80,auVar80);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar79,auVar79);
    auVar107 = vrcp14ps_avx512vl(auVar106);
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar260 = ZEXT3264(auVar108);
    auVar109 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar108);
    auVar107 = vfmadd132ps_avx512vl(auVar109,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar105,auVar107);
    auVar109 = vmulps_avx512vl(auVar80,auVar103);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar102,auVar93);
    auVar110 = vmulps_avx512vl(auVar93,auVar101);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar103,auVar79);
    auVar111 = vmulps_avx512vl(auVar79,auVar102);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar101,auVar80);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar107 = vmulps_avx512vl(auVar109,auVar107);
    auVar105 = vmaxps_avx512vl(auVar105,auVar107);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar107 = vmaxps_avx512vl(auVar104,auVar100);
    auVar92 = vmaxps_avx512vl(auVar92,auVar107);
    auVar111 = vaddps_avx512vl(auVar105,auVar92);
    auVar92 = vminps_avx512vl(auVar104,auVar100);
    auVar92 = vminps_avx(auVar81,auVar92);
    auVar92 = vsubps_avx512vl(auVar92,auVar105);
    auVar107._8_4_ = 0x3f800002;
    auVar107._0_8_ = 0x3f8000023f800002;
    auVar107._12_4_ = 0x3f800002;
    auVar107._16_4_ = 0x3f800002;
    auVar107._20_4_ = 0x3f800002;
    auVar107._24_4_ = 0x3f800002;
    auVar107._28_4_ = 0x3f800002;
    auVar81 = vmulps_avx512vl(auVar111,auVar107);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    auVar92 = vmulps_avx512vl(auVar92,auVar109);
    auVar81 = vmulps_avx512vl(auVar81,auVar81);
    auVar100 = vrsqrt14ps_avx512vl(auVar106);
    auVar110._8_4_ = 0xbf000000;
    auVar110._0_8_ = 0xbf000000bf000000;
    auVar110._12_4_ = 0xbf000000;
    auVar110._16_4_ = 0xbf000000;
    auVar110._20_4_ = 0xbf000000;
    auVar110._24_4_ = 0xbf000000;
    auVar110._28_4_ = 0xbf000000;
    auVar104 = vmulps_avx512vl(auVar106,auVar110);
    fVar223 = auVar100._0_4_;
    fVar202 = auVar100._4_4_;
    fVar218 = auVar100._8_4_;
    fVar219 = auVar100._12_4_;
    fVar220 = auVar100._16_4_;
    fVar221 = auVar100._20_4_;
    fVar222 = auVar100._24_4_;
    auVar40._4_4_ = fVar202 * fVar202 * fVar202 * auVar104._4_4_;
    auVar40._0_4_ = fVar223 * fVar223 * fVar223 * auVar104._0_4_;
    auVar40._8_4_ = fVar218 * fVar218 * fVar218 * auVar104._8_4_;
    auVar40._12_4_ = fVar219 * fVar219 * fVar219 * auVar104._12_4_;
    auVar40._16_4_ = fVar220 * fVar220 * fVar220 * auVar104._16_4_;
    auVar40._20_4_ = fVar221 * fVar221 * fVar221 * auVar104._20_4_;
    auVar40._24_4_ = fVar222 * fVar222 * fVar222 * auVar104._24_4_;
    auVar40._28_4_ = auVar111._28_4_;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_avx512vl(auVar40,auVar100,auVar111);
    auVar104 = vmulps_avx512vl(auVar79,auVar100);
    auVar105 = vmulps_avx512vl(auVar80,auVar100);
    auVar106 = vmulps_avx512vl(auVar93,auVar100);
    auVar107 = vsubps_avx512vl(auVar116,auVar95);
    auVar109 = vsubps_avx512vl(auVar116,auVar96);
    auVar110 = vsubps_avx512vl(auVar116,auVar97);
    auVar111 = vmulps_avx512vl(local_880,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_860,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_840,auVar107);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,auVar107);
    auVar113 = vmulps_avx512vl(local_880,auVar106);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,local_860);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,local_840);
    auVar106 = vmulps_avx512vl(auVar110,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar109,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar104);
    auVar105 = vmulps_avx512vl(auVar113,auVar113);
    auVar106 = vsubps_avx512vl(local_580,auVar105);
    auVar114 = vmulps_avx512vl(auVar113,auVar104);
    auVar111 = vsubps_avx512vl(auVar111,auVar114);
    auVar111 = vaddps_avx512vl(auVar111,auVar111);
    auVar114 = vmulps_avx512vl(auVar104,auVar104);
    auVar114 = vsubps_avx512vl(auVar112,auVar114);
    auVar81 = vsubps_avx512vl(auVar114,auVar81);
    auVar115 = vmulps_avx512vl(auVar111,auVar111);
    auVar112._8_4_ = 0x40800000;
    auVar112._0_8_ = 0x4080000040800000;
    auVar112._12_4_ = 0x40800000;
    auVar112._16_4_ = 0x40800000;
    auVar112._20_4_ = 0x40800000;
    auVar112._24_4_ = 0x40800000;
    auVar112._28_4_ = 0x40800000;
    _local_8a0 = vmulps_avx512vl(auVar106,auVar112);
    auVar112 = vmulps_avx512vl(_local_8a0,auVar81);
    auVar112 = vsubps_avx512vl(auVar115,auVar112);
    uVar67 = vcmpps_avx512vl(auVar112,auVar116,5);
    bVar56 = (byte)uVar67;
    if (bVar56 == 0) {
LAB_01a4c361:
      auVar163 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      local_800._0_32_ = auVar114;
      auVar112 = vsqrtps_avx512vl(auVar112);
      auVar116 = vaddps_avx512vl(auVar106,auVar106);
      local_8c0 = vrcp14ps_avx512vl(auVar116);
      auVar108 = vfnmadd213ps_avx512vl(local_8c0,auVar116,auVar108);
      auVar108 = vfmadd132ps_avx512vl(auVar108,local_8c0,local_8c0);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar27._16_4_ = 0x80000000;
      auVar27._20_4_ = 0x80000000;
      auVar27._24_4_ = 0x80000000;
      auVar27._28_4_ = 0x80000000;
      local_8e0 = vxorps_avx512vl(auVar111,auVar27);
      auVar117 = vsubps_avx512vl(local_8e0,auVar112);
      auVar117 = vmulps_avx512vl(auVar117,auVar108);
      auVar112 = vsubps_avx512vl(auVar112,auVar111);
      local_900 = vmulps_avx512vl(auVar112,auVar108);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar108 = vblendmps_avx512vl(auVar112,auVar117);
      auVar118._0_4_ =
           (uint)(bVar56 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar112._0_4_;
      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar66 * auVar108._4_4_ | (uint)!bVar66 * auVar112._4_4_;
      bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar66 * auVar108._8_4_ | (uint)!bVar66 * auVar112._8_4_;
      bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar66 * auVar108._12_4_ | (uint)!bVar66 * auVar112._12_4_;
      bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar66 * auVar108._16_4_ | (uint)!bVar66 * auVar112._16_4_;
      bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar66 * auVar108._20_4_ | (uint)!bVar66 * auVar112._20_4_;
      bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar66 * auVar108._24_4_ | (uint)!bVar66 * auVar112._24_4_;
      bVar66 = SUB81(uVar67 >> 7,0);
      auVar118._28_4_ = (uint)bVar66 * auVar108._28_4_ | (uint)!bVar66 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar108 = vblendmps_avx512vl(auVar112,local_900);
      auVar119._0_4_ =
           (uint)(bVar56 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar112._0_4_;
      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar66 * auVar108._4_4_ | (uint)!bVar66 * auVar112._4_4_;
      bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar66 * auVar108._8_4_ | (uint)!bVar66 * auVar112._8_4_;
      bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar66 * auVar108._12_4_ | (uint)!bVar66 * auVar112._12_4_;
      bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar66 * auVar108._16_4_ | (uint)!bVar66 * auVar112._16_4_;
      bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar66 * auVar108._20_4_ | (uint)!bVar66 * auVar112._20_4_;
      bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar66 * auVar108._24_4_ | (uint)!bVar66 * auVar112._24_4_;
      bVar66 = SUB81(uVar67 >> 7,0);
      auVar119._28_4_ = (uint)bVar66 * auVar108._28_4_ | (uint)!bVar66 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar112);
      local_a20 = vmaxps_avx512vl(local_5a0,auVar112);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      local_a40 = vmulps_avx512vl(local_a20,auVar28);
      vandps_avx512vl(auVar106,auVar112);
      uVar63 = vcmpps_avx512vl(local_a40,local_a40,1);
      uVar67 = uVar67 & uVar63;
      bVar62 = (byte)uVar67;
      if (bVar62 != 0) {
        uVar63 = vcmpps_avx512vl(auVar81,_DAT_01f7b000,2);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar81,auVar105);
        bVar61 = (byte)uVar63;
        uVar68 = (uint)(bVar61 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar61 & 1) * local_a40._0_4_;
        bVar66 = (bool)((byte)(uVar63 >> 1) & 1);
        uVar138 = (uint)bVar66 * auVar106._4_4_ | (uint)!bVar66 * local_a40._4_4_;
        bVar66 = (bool)((byte)(uVar63 >> 2) & 1);
        uVar139 = (uint)bVar66 * auVar106._8_4_ | (uint)!bVar66 * local_a40._8_4_;
        bVar66 = (bool)((byte)(uVar63 >> 3) & 1);
        uVar140 = (uint)bVar66 * auVar106._12_4_ | (uint)!bVar66 * local_a40._12_4_;
        bVar66 = (bool)((byte)(uVar63 >> 4) & 1);
        uVar141 = (uint)bVar66 * auVar106._16_4_ | (uint)!bVar66 * local_a40._16_4_;
        bVar66 = (bool)((byte)(uVar63 >> 5) & 1);
        uVar142 = (uint)bVar66 * auVar106._20_4_ | (uint)!bVar66 * local_a40._20_4_;
        bVar66 = (bool)((byte)(uVar63 >> 6) & 1);
        uVar143 = (uint)bVar66 * auVar106._24_4_ | (uint)!bVar66 * local_a40._24_4_;
        bVar66 = SUB81(uVar63 >> 7,0);
        uVar144 = (uint)bVar66 * auVar106._28_4_ | (uint)!bVar66 * local_a40._28_4_;
        auVar118._0_4_ = (bVar62 & 1) * uVar68 | !(bool)(bVar62 & 1) * auVar118._0_4_;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar118._4_4_ = bVar66 * uVar138 | !bVar66 * auVar118._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar118._8_4_ = bVar66 * uVar139 | !bVar66 * auVar118._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar118._12_4_ = bVar66 * uVar140 | !bVar66 * auVar118._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar118._16_4_ = bVar66 * uVar141 | !bVar66 * auVar118._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar118._20_4_ = bVar66 * uVar142 | !bVar66 * auVar118._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar118._24_4_ = bVar66 * uVar143 | !bVar66 * auVar118._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar118._28_4_ = bVar66 * uVar144 | !bVar66 * auVar118._28_4_;
        auVar81 = vblendmps_avx512vl(auVar105,auVar81);
        bVar66 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
        bVar11 = SUB81(uVar63 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar62 & 1) *
             ((uint)(bVar61 & 1) * auVar81._0_4_ | !(bool)(bVar61 & 1) * uVar68) |
             !(bool)(bVar62 & 1) * auVar119._0_4_;
        bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar5 * ((uint)bVar66 * auVar81._4_4_ | !bVar66 * uVar138) |
             !bVar5 * auVar119._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar66 * ((uint)bVar6 * auVar81._8_4_ | !bVar6 * uVar139) |
             !bVar66 * auVar119._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar66 * ((uint)bVar7 * auVar81._12_4_ | !bVar7 * uVar140) |
             !bVar66 * auVar119._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar66 * ((uint)bVar8 * auVar81._16_4_ | !bVar8 * uVar141) |
             !bVar66 * auVar119._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar66 * ((uint)bVar9 * auVar81._20_4_ | !bVar9 * uVar142) |
             !bVar66 * auVar119._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar66 * ((uint)bVar10 * auVar81._24_4_ | !bVar10 * uVar143) |
             !bVar66 * auVar119._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar66 * ((uint)bVar11 * auVar81._28_4_ | !bVar11 * uVar144) |
             !bVar66 * auVar119._28_4_;
        bVar56 = (~bVar62 | bVar61) & bVar56;
      }
      if ((bVar56 & 0x7f) == 0) {
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar260 = ZEXT3264(auVar92);
        goto LAB_01a4c361;
      }
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar103 = vxorps_avx512vl(auVar103,auVar81);
      auVar101 = vxorps_avx512vl(auVar101,auVar81);
      auVar163 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar102 = vxorps_avx512vl(auVar102,auVar81);
      auVar69 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                               ZEXT416((uint)local_950._0_4_));
      auVar105 = vbroadcastss_avx512vl(auVar69);
      auVar105 = vminps_avx512vl(auVar105,auVar119);
      auVar55._4_4_ = fStack_65c;
      auVar55._0_4_ = local_660;
      auVar55._8_4_ = fStack_658;
      auVar55._12_4_ = fStack_654;
      auVar55._16_4_ = fStack_650;
      auVar55._20_4_ = fStack_64c;
      auVar55._24_4_ = fStack_648;
      auVar55._28_4_ = fStack_644;
      auVar106 = vmaxps_avx512vl(auVar55,auVar118);
      auVar110 = vmulps_avx512vl(auVar110,auVar38);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar37,auVar110);
      auVar69 = vfmadd213ps_fma(auVar107,auVar36,auVar109);
      auVar107 = vmulps_avx512vl(local_880,auVar38);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_860,auVar37);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_840,auVar36);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar109);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar109,auVar110,1);
      auVar112 = vxorps_avx512vl(ZEXT1632(auVar69),auVar81);
      auVar108 = vrcp14ps_avx512vl(auVar107);
      auVar120 = vxorps_avx512vl(auVar107,auVar81);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar122 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar121);
      auVar69 = vfmadd132ps_fma(auVar122,auVar108,auVar108);
      fVar223 = auVar69._0_4_ * auVar112._0_4_;
      fVar202 = auVar69._4_4_ * auVar112._4_4_;
      auVar41._4_4_ = fVar202;
      auVar41._0_4_ = fVar223;
      fVar218 = auVar69._8_4_ * auVar112._8_4_;
      auVar41._8_4_ = fVar218;
      fVar219 = auVar69._12_4_ * auVar112._12_4_;
      auVar41._12_4_ = fVar219;
      fVar220 = auVar112._16_4_ * 0.0;
      auVar41._16_4_ = fVar220;
      fVar221 = auVar112._20_4_ * 0.0;
      auVar41._20_4_ = fVar221;
      fVar222 = auVar112._24_4_ * 0.0;
      auVar41._24_4_ = fVar222;
      auVar41._28_4_ = auVar112._28_4_;
      uVar16 = vcmpps_avx512vl(auVar107,auVar120,1);
      bVar62 = (byte)uVar14 | (byte)uVar16;
      auVar257._8_4_ = 0xff800000;
      auVar257._0_8_ = 0xff800000ff800000;
      auVar257._12_4_ = 0xff800000;
      auVar257._16_4_ = 0xff800000;
      auVar257._20_4_ = 0xff800000;
      auVar257._24_4_ = 0xff800000;
      auVar257._28_4_ = 0xff800000;
      auVar108 = vblendmps_avx512vl(auVar41,auVar257);
      auVar123._0_4_ = (uint)(bVar62 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar62 & 1) * -0x800000;
      bVar66 = (bool)(bVar62 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar66 * auVar108._4_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar62 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar66 * auVar108._8_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar62 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar66 * auVar108._12_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar62 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar66 * auVar108._16_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar62 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar66 * auVar108._20_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar62 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar66 * auVar108._24_4_ | (uint)!bVar66 * -0x800000;
      auVar123._28_4_ =
           (uint)(bVar62 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar62 >> 7) * -0x800000;
      auVar108 = vmaxps_avx512vl(auVar106,auVar123);
      uVar16 = vcmpps_avx512vl(auVar107,auVar120,6);
      bVar62 = (byte)uVar14 | (byte)uVar16;
      auVar124._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar223;
      bVar66 = (bool)(bVar62 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar202;
      bVar66 = (bool)(bVar62 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar218;
      bVar66 = (bool)(bVar62 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar219;
      bVar66 = (bool)(bVar62 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar220;
      bVar66 = (bool)(bVar62 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar221;
      bVar66 = (bool)(bVar62 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar222;
      auVar124._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar112._28_4_;
      auVar105 = vminps_avx512vl(auVar105,auVar124);
      auVar69 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar69),auVar94);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar69),auVar98);
      auVar106 = ZEXT1632(auVar69);
      auVar99 = vsubps_avx512vl(auVar106,auVar99);
      auVar99 = vmulps_avx512vl(auVar99,auVar103);
      auVar98 = vfmadd231ps_avx512vl(auVar99,auVar102,auVar98);
      auVar94 = vfmadd231ps_avx512vl(auVar98,auVar101,auVar94);
      auVar98 = vmulps_avx512vl(local_880,auVar103);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_860,auVar102);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_840,auVar101);
      vandps_avx512vl(auVar98,auVar109);
      auVar260 = ZEXT3264(auVar121);
      uVar14 = vcmpps_avx512vl(auVar98,auVar110,1);
      auVar94 = vxorps_avx512vl(auVar94,auVar81);
      auVar99 = vrcp14ps_avx512vl(auVar98);
      auVar101 = vxorps_avx512vl(auVar98,auVar81);
      auVar253 = ZEXT3264(auVar101);
      auVar81 = vfnmadd213ps_avx512vl(auVar99,auVar98,auVar121);
      auVar69 = vfmadd132ps_fma(auVar81,auVar99,auVar99);
      fVar223 = auVar69._0_4_ * auVar94._0_4_;
      fVar202 = auVar69._4_4_ * auVar94._4_4_;
      auVar42._4_4_ = fVar202;
      auVar42._0_4_ = fVar223;
      fVar218 = auVar69._8_4_ * auVar94._8_4_;
      auVar42._8_4_ = fVar218;
      fVar219 = auVar69._12_4_ * auVar94._12_4_;
      auVar42._12_4_ = fVar219;
      fVar220 = auVar94._16_4_ * 0.0;
      auVar42._16_4_ = fVar220;
      fVar221 = auVar94._20_4_ * 0.0;
      auVar42._20_4_ = fVar221;
      fVar222 = auVar94._24_4_ * 0.0;
      auVar42._24_4_ = fVar222;
      auVar42._28_4_ = auVar94._28_4_;
      uVar16 = vcmpps_avx512vl(auVar98,auVar101,1);
      bVar62 = (byte)uVar14 | (byte)uVar16;
      auVar29._8_4_ = 0xff800000;
      auVar29._0_8_ = 0xff800000ff800000;
      auVar29._12_4_ = 0xff800000;
      auVar29._16_4_ = 0xff800000;
      auVar29._20_4_ = 0xff800000;
      auVar29._24_4_ = 0xff800000;
      auVar29._28_4_ = 0xff800000;
      auVar81 = vblendmps_avx512vl(auVar42,auVar29);
      auVar125._0_4_ =
           (uint)(bVar62 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar99._0_4_;
      bVar66 = (bool)(bVar62 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * auVar99._4_4_;
      bVar66 = (bool)(bVar62 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * auVar99._8_4_;
      bVar66 = (bool)(bVar62 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * auVar99._12_4_;
      bVar66 = (bool)(bVar62 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar66 * auVar81._16_4_ | (uint)!bVar66 * auVar99._16_4_;
      bVar66 = (bool)(bVar62 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar66 * auVar81._20_4_ | (uint)!bVar66 * auVar99._20_4_;
      bVar66 = (bool)(bVar62 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar66 * auVar81._24_4_ | (uint)!bVar66 * auVar99._24_4_;
      auVar125._28_4_ =
           (uint)(bVar62 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar99._28_4_;
      auVar81 = vmaxps_avx(auVar108,auVar125);
      auVar251 = ZEXT3264(auVar81);
      uVar16 = vcmpps_avx512vl(auVar98,auVar101,6);
      bVar62 = (byte)uVar14 | (byte)uVar16;
      auVar126._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar223;
      bVar66 = (bool)(bVar62 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar202;
      bVar66 = (bool)(bVar62 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar218;
      bVar66 = (bool)(bVar62 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar219;
      bVar66 = (bool)(bVar62 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar220;
      bVar66 = (bool)(bVar62 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar221;
      bVar66 = (bool)(bVar62 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar222;
      auVar126._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar94._28_4_;
      local_6c0 = vminps_avx(auVar105,auVar126);
      uVar14 = vcmpps_avx512vl(auVar81,local_6c0,2);
      bVar56 = bVar56 & 0x7f & (byte)uVar14;
      if (bVar56 == 0) goto LAB_01a4c361;
      auVar94 = vmaxps_avx512vl(auVar106,auVar92);
      auVar92 = vfmadd213ps_avx512vl(auVar117,auVar113,auVar104);
      fVar223 = auVar100._0_4_;
      fVar202 = auVar100._4_4_;
      auVar43._4_4_ = fVar202 * auVar92._4_4_;
      auVar43._0_4_ = fVar223 * auVar92._0_4_;
      fVar218 = auVar100._8_4_;
      auVar43._8_4_ = fVar218 * auVar92._8_4_;
      fVar219 = auVar100._12_4_;
      auVar43._12_4_ = fVar219 * auVar92._12_4_;
      fVar220 = auVar100._16_4_;
      auVar43._16_4_ = fVar220 * auVar92._16_4_;
      fVar221 = auVar100._20_4_;
      auVar43._20_4_ = fVar221 * auVar92._20_4_;
      fVar222 = auVar100._24_4_;
      auVar43._24_4_ = fVar222 * auVar92._24_4_;
      auVar43._28_4_ = auVar92._28_4_;
      auVar92 = vfmadd213ps_avx512vl(local_900,auVar113,auVar104);
      auVar44._4_4_ = fVar202 * auVar92._4_4_;
      auVar44._0_4_ = fVar223 * auVar92._0_4_;
      auVar44._8_4_ = fVar218 * auVar92._8_4_;
      auVar44._12_4_ = fVar219 * auVar92._12_4_;
      auVar44._16_4_ = fVar220 * auVar92._16_4_;
      auVar44._20_4_ = fVar221 * auVar92._20_4_;
      auVar44._24_4_ = fVar222 * auVar92._24_4_;
      auVar44._28_4_ = auVar92._28_4_;
      auVar92 = vminps_avx512vl(auVar43,auVar121);
      auVar98 = ZEXT832(0) << 0x20;
      auVar92 = vmaxps_avx(auVar92,ZEXT832(0) << 0x20);
      auVar99 = vminps_avx512vl(auVar44,auVar121);
      auVar45._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar92._28_4_ + 7.0;
      local_520 = vfmadd213ps_avx512vl(auVar45,auVar155,auVar226);
      auVar92 = vmaxps_avx(auVar99,ZEXT832(0) << 0x20);
      auVar46._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar46._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar46._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar46._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar46._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar46._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar46._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar46._28_4_ = auVar92._28_4_ + 7.0;
      local_540 = vfmadd213ps_avx512vl(auVar46,auVar155,auVar226);
      auVar47._4_4_ = auVar94._4_4_ * auVar94._4_4_;
      auVar47._0_4_ = auVar94._0_4_ * auVar94._0_4_;
      auVar47._8_4_ = auVar94._8_4_ * auVar94._8_4_;
      auVar47._12_4_ = auVar94._12_4_ * auVar94._12_4_;
      auVar47._16_4_ = auVar94._16_4_ * auVar94._16_4_;
      auVar47._20_4_ = auVar94._20_4_ * auVar94._20_4_;
      auVar47._24_4_ = auVar94._24_4_ * auVar94._24_4_;
      auVar47._28_4_ = auVar94._28_4_;
      auVar92 = vsubps_avx(auVar114,auVar47);
      auVar48._4_4_ = auVar92._4_4_ * (float)local_8a0._4_4_;
      auVar48._0_4_ = auVar92._0_4_ * (float)local_8a0._0_4_;
      auVar48._8_4_ = auVar92._8_4_ * fStack_898;
      auVar48._12_4_ = auVar92._12_4_ * fStack_894;
      auVar48._16_4_ = auVar92._16_4_ * fStack_890;
      auVar48._20_4_ = auVar92._20_4_ * fStack_88c;
      auVar48._24_4_ = auVar92._24_4_ * fStack_888;
      auVar48._28_4_ = auVar94._28_4_;
      auVar94 = vsubps_avx(auVar115,auVar48);
      uVar14 = vcmpps_avx512vl(auVar94,ZEXT832(0) << 0x20,5);
      bVar62 = (byte)uVar14;
      if (bVar62 == 0) {
        bVar62 = 0;
        auVar79 = ZEXT832(0) << 0x20;
        auVar242 = ZEXT864(0) << 0x20;
        auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar251 = ZEXT864(0) << 0x20;
        auVar127._8_4_ = 0x7f800000;
        auVar127._0_8_ = 0x7f8000007f800000;
        auVar127._12_4_ = 0x7f800000;
        auVar127._16_4_ = 0x7f800000;
        auVar127._20_4_ = 0x7f800000;
        auVar127._24_4_ = 0x7f800000;
        auVar127._28_4_ = 0x7f800000;
        auVar128._8_4_ = 0xff800000;
        auVar128._0_8_ = 0xff800000ff800000;
        auVar128._12_4_ = 0xff800000;
        auVar128._16_4_ = 0xff800000;
        auVar128._20_4_ = 0xff800000;
        auVar128._24_4_ = 0xff800000;
        auVar128._28_4_ = 0xff800000;
      }
      else {
        auVar71 = vxorps_avx512vl(auVar146,auVar146);
        uVar67 = vcmpps_avx512vl(auVar94,auVar106,5);
        auVar94 = vsqrtps_avx(auVar94);
        auVar98 = vfnmadd213ps_avx512vl(auVar116,local_8c0,auVar121);
        auVar101 = vfmadd132ps_avx512vl(auVar98,local_8c0,local_8c0);
        auVar98 = vsubps_avx(local_8e0,auVar94);
        auVar102 = vmulps_avx512vl(auVar98,auVar101);
        auVar94 = vsubps_avx512vl(auVar94,auVar111);
        auVar101 = vmulps_avx512vl(auVar94,auVar101);
        auVar94 = vfmadd213ps_avx512vl(auVar113,auVar102,auVar104);
        auVar49._4_4_ = fVar202 * auVar94._4_4_;
        auVar49._0_4_ = fVar223 * auVar94._0_4_;
        auVar49._8_4_ = fVar218 * auVar94._8_4_;
        auVar49._12_4_ = fVar219 * auVar94._12_4_;
        auVar49._16_4_ = fVar220 * auVar94._16_4_;
        auVar49._20_4_ = fVar221 * auVar94._20_4_;
        auVar49._24_4_ = fVar222 * auVar94._24_4_;
        auVar49._28_4_ = auVar99._28_4_;
        auVar94 = vmulps_avx512vl(local_840,auVar102);
        auVar98 = vmulps_avx512vl(local_860,auVar102);
        auVar103 = vmulps_avx512vl(local_880,auVar102);
        auVar99 = vfmadd213ps_avx512vl(auVar79,auVar49,auVar95);
        auVar94 = vsubps_avx512vl(auVar94,auVar99);
        auVar99 = vfmadd213ps_avx512vl(auVar80,auVar49,auVar96);
        auVar99 = vsubps_avx512vl(auVar98,auVar99);
        auVar69 = vfmadd213ps_fma(auVar49,auVar93,auVar97);
        auVar98 = vsubps_avx(auVar103,ZEXT1632(auVar69));
        auVar251 = ZEXT3264(auVar98);
        auVar98 = vfmadd213ps_avx512vl(auVar113,auVar101,auVar104);
        auVar100 = vmulps_avx512vl(auVar100,auVar98);
        auVar98 = vmulps_avx512vl(local_840,auVar101);
        auVar103 = vmulps_avx512vl(local_860,auVar101);
        auVar104 = vmulps_avx512vl(local_880,auVar101);
        auVar69 = vfmadd213ps_fma(auVar79,auVar100,auVar95);
        auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar69));
        auVar69 = vfmadd213ps_fma(auVar80,auVar100,auVar96);
        auVar79 = vsubps_avx512vl(auVar103,ZEXT1632(auVar69));
        auVar69 = vfmadd213ps_fma(auVar93,auVar100,auVar97);
        auVar80 = vsubps_avx512vl(auVar104,ZEXT1632(auVar69));
        auVar242 = ZEXT3264(auVar80);
        auVar156._8_4_ = 0x7f800000;
        auVar156._0_8_ = 0x7f8000007f800000;
        auVar156._12_4_ = 0x7f800000;
        auVar156._16_4_ = 0x7f800000;
        auVar156._20_4_ = 0x7f800000;
        auVar156._24_4_ = 0x7f800000;
        auVar156._28_4_ = 0x7f800000;
        auVar80 = vblendmps_avx512vl(auVar156,auVar102);
        bVar66 = (bool)((byte)uVar67 & 1);
        auVar127._0_4_ = (uint)bVar66 * auVar80._0_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar66 * auVar80._4_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar66 * auVar80._8_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar66 * auVar80._12_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar66 * auVar80._16_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar66 * auVar80._20_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar66 * auVar80._24_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar127._28_4_ = (uint)bVar66 * auVar80._28_4_ | (uint)!bVar66 * 0x7f800000;
        auVar198._8_4_ = 0xff800000;
        auVar198._0_8_ = 0xff800000ff800000;
        auVar198._12_4_ = 0xff800000;
        auVar198._16_4_ = 0xff800000;
        auVar198._20_4_ = 0xff800000;
        auVar198._24_4_ = 0xff800000;
        auVar198._28_4_ = 0xff800000;
        auVar80 = vblendmps_avx512vl(auVar198,auVar101);
        bVar66 = (bool)((byte)uVar67 & 1);
        auVar128._0_4_ = (uint)bVar66 * auVar80._0_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar66 * auVar80._4_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar66 * auVar80._8_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar66 * auVar80._12_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar128._16_4_ = (uint)bVar66 * auVar80._16_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar128._20_4_ = (uint)bVar66 * auVar80._20_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar128._24_4_ = (uint)bVar66 * auVar80._24_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar128._28_4_ = (uint)bVar66 * auVar80._28_4_ | (uint)!bVar66 * -0x800000;
        auVar30._8_4_ = 0x36000000;
        auVar30._0_8_ = 0x3600000036000000;
        auVar30._12_4_ = 0x36000000;
        auVar30._16_4_ = 0x36000000;
        auVar30._20_4_ = 0x36000000;
        auVar30._24_4_ = 0x36000000;
        auVar30._28_4_ = 0x36000000;
        auVar80 = vmulps_avx512vl(local_a20,auVar30);
        uVar63 = vcmpps_avx512vl(auVar80,local_a40,0xe);
        uVar67 = uVar67 & uVar63;
        bVar61 = (byte)uVar67;
        if (bVar61 != 0) {
          uVar63 = vcmpps_avx512vl(auVar92,ZEXT1632(auVar71),2);
          auVar246._8_4_ = 0x7f800000;
          auVar246._0_8_ = 0x7f8000007f800000;
          auVar246._12_4_ = 0x7f800000;
          auVar246._16_4_ = 0x7f800000;
          auVar246._20_4_ = 0x7f800000;
          auVar246._24_4_ = 0x7f800000;
          auVar246._28_4_ = 0x7f800000;
          auVar258._8_4_ = 0xff800000;
          auVar258._0_8_ = 0xff800000ff800000;
          auVar258._12_4_ = 0xff800000;
          auVar258._16_4_ = 0xff800000;
          auVar258._20_4_ = 0xff800000;
          auVar258._24_4_ = 0xff800000;
          auVar258._28_4_ = 0xff800000;
          auVar92 = vblendmps_avx512vl(auVar246,auVar258);
          bVar57 = (byte)uVar63;
          uVar68 = (uint)(bVar57 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar80._0_4_;
          bVar66 = (bool)((byte)(uVar63 >> 1) & 1);
          uVar138 = (uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * auVar80._4_4_;
          bVar66 = (bool)((byte)(uVar63 >> 2) & 1);
          uVar139 = (uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * auVar80._8_4_;
          bVar66 = (bool)((byte)(uVar63 >> 3) & 1);
          uVar140 = (uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * auVar80._12_4_;
          bVar66 = (bool)((byte)(uVar63 >> 4) & 1);
          uVar141 = (uint)bVar66 * auVar92._16_4_ | (uint)!bVar66 * auVar80._16_4_;
          bVar66 = (bool)((byte)(uVar63 >> 5) & 1);
          uVar142 = (uint)bVar66 * auVar92._20_4_ | (uint)!bVar66 * auVar80._20_4_;
          bVar66 = (bool)((byte)(uVar63 >> 6) & 1);
          uVar143 = (uint)bVar66 * auVar92._24_4_ | (uint)!bVar66 * auVar80._24_4_;
          bVar66 = SUB81(uVar63 >> 7,0);
          uVar144 = (uint)bVar66 * auVar92._28_4_ | (uint)!bVar66 * auVar80._28_4_;
          auVar127._0_4_ = (bVar61 & 1) * uVar68 | !(bool)(bVar61 & 1) * auVar127._0_4_;
          bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar127._4_4_ = bVar66 * uVar138 | !bVar66 * auVar127._4_4_;
          bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar127._8_4_ = bVar66 * uVar139 | !bVar66 * auVar127._8_4_;
          bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar127._12_4_ = bVar66 * uVar140 | !bVar66 * auVar127._12_4_;
          bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar127._16_4_ = bVar66 * uVar141 | !bVar66 * auVar127._16_4_;
          bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar127._20_4_ = bVar66 * uVar142 | !bVar66 * auVar127._20_4_;
          bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar127._24_4_ = bVar66 * uVar143 | !bVar66 * auVar127._24_4_;
          bVar66 = SUB81(uVar67 >> 7,0);
          auVar127._28_4_ = bVar66 * uVar144 | !bVar66 * auVar127._28_4_;
          auVar92 = vblendmps_avx512vl(auVar258,auVar246);
          bVar66 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar128._0_4_ =
               (uint)(bVar61 & 1) *
               ((uint)(bVar57 & 1) * auVar92._0_4_ | !(bool)(bVar57 & 1) * uVar68) |
               !(bool)(bVar61 & 1) * auVar128._0_4_;
          bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar128._4_4_ =
               (uint)bVar5 * ((uint)bVar66 * auVar92._4_4_ | !bVar66 * uVar138) |
               !bVar5 * auVar128._4_4_;
          bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar128._8_4_ =
               (uint)bVar66 * ((uint)bVar6 * auVar92._8_4_ | !bVar6 * uVar139) |
               !bVar66 * auVar128._8_4_;
          bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar128._12_4_ =
               (uint)bVar66 * ((uint)bVar7 * auVar92._12_4_ | !bVar7 * uVar140) |
               !bVar66 * auVar128._12_4_;
          bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar128._16_4_ =
               (uint)bVar66 * ((uint)bVar8 * auVar92._16_4_ | !bVar8 * uVar141) |
               !bVar66 * auVar128._16_4_;
          bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar128._20_4_ =
               (uint)bVar66 * ((uint)bVar9 * auVar92._20_4_ | !bVar9 * uVar142) |
               !bVar66 * auVar128._20_4_;
          bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar128._24_4_ =
               (uint)bVar66 * ((uint)bVar10 * auVar92._24_4_ | !bVar10 * uVar143) |
               !bVar66 * auVar128._24_4_;
          bVar66 = SUB81(uVar67 >> 7,0);
          auVar128._28_4_ =
               (uint)bVar66 * ((uint)bVar11 * auVar92._28_4_ | !bVar11 * uVar144) |
               !bVar66 * auVar128._28_4_;
          bVar62 = (~bVar61 | bVar57) & bVar62;
        }
      }
      auVar247._0_4_ = local_880._0_4_ * auVar242._0_4_;
      auVar247._4_4_ = local_880._4_4_ * auVar242._4_4_;
      auVar247._8_4_ = local_880._8_4_ * auVar242._8_4_;
      auVar247._12_4_ = local_880._12_4_ * auVar242._12_4_;
      auVar247._16_4_ = local_880._16_4_ * auVar242._16_4_;
      auVar247._20_4_ = local_880._20_4_ * auVar242._20_4_;
      auVar247._28_36_ = auVar242._28_36_;
      auVar247._24_4_ = local_880._24_4_ * auVar242._24_4_;
      auVar69 = vfmadd231ps_fma(auVar247._0_32_,local_860,auVar79);
      auVar247 = ZEXT3264(local_840);
      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_840,auVar98);
      auVar241._8_4_ = 0x7fffffff;
      auVar241._0_8_ = 0x7fffffff7fffffff;
      auVar241._12_4_ = 0x7fffffff;
      auVar241._16_4_ = 0x7fffffff;
      auVar241._20_4_ = 0x7fffffff;
      auVar241._24_4_ = 0x7fffffff;
      auVar241._28_4_ = 0x7fffffff;
      auVar242 = ZEXT3264(auVar241);
      auVar92 = vandps_avx(ZEXT1632(auVar69),auVar241);
      auVar253 = ZEXT3264(auVar81);
      _local_440 = auVar81;
      auVar234._8_4_ = 0x3e99999a;
      auVar234._0_8_ = 0x3e99999a3e99999a;
      auVar234._12_4_ = 0x3e99999a;
      auVar234._16_4_ = 0x3e99999a;
      auVar234._20_4_ = 0x3e99999a;
      auVar234._24_4_ = 0x3e99999a;
      auVar234._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar92,auVar234,1);
      _local_760 = vmaxps_avx(auVar81,auVar128);
      auVar92 = vminps_avx(local_6c0,auVar127);
      uVar16 = vcmpps_avx512vl(auVar81,auVar92,2);
      bVar61 = (byte)uVar16 & bVar56;
      uVar15 = vcmpps_avx512vl(_local_760,local_6c0,2);
      if ((bVar56 & ((byte)uVar15 | (byte)uVar16)) == 0) {
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      }
      else {
        bVar57 = (byte)uVar14 | ~bVar62;
        auVar50._4_4_ = local_880._4_4_ * auVar251._4_4_;
        auVar50._0_4_ = local_880._0_4_ * auVar251._0_4_;
        auVar50._8_4_ = local_880._8_4_ * auVar251._8_4_;
        auVar50._12_4_ = local_880._12_4_ * auVar251._12_4_;
        auVar50._16_4_ = local_880._16_4_ * auVar251._16_4_;
        auVar50._20_4_ = local_880._20_4_ * auVar251._20_4_;
        auVar50._24_4_ = local_880._24_4_ * auVar251._24_4_;
        auVar50._28_4_ = auVar92._28_4_;
        auVar69 = vfmadd213ps_fma(auVar99,local_860,auVar50);
        auVar69 = vfmadd213ps_fma(auVar94,local_840,ZEXT1632(auVar69));
        auVar92 = vandps_avx(ZEXT1632(auVar69),auVar241);
        uVar14 = vcmpps_avx512vl(auVar92,auVar234,1);
        bVar62 = (byte)uVar14 | ~bVar62;
        auVar157._8_4_ = 2;
        auVar157._0_8_ = 0x200000002;
        auVar157._12_4_ = 2;
        auVar157._16_4_ = 2;
        auVar157._20_4_ = 2;
        auVar157._24_4_ = 2;
        auVar157._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar157,auVar31);
        local_6a0._0_4_ = (uint)(bVar62 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar66 = (bool)(bVar62 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar62 >> 2 & 1);
        local_6a0._8_4_ = (uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar62 >> 3 & 1);
        local_6a0._12_4_ = (uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar62 >> 4 & 1);
        local_6a0._16_4_ = (uint)bVar66 * auVar92._16_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar62 >> 5 & 1);
        local_6a0._20_4_ = (uint)bVar66 * auVar92._20_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar62 >> 6 & 1);
        local_6a0._24_4_ = (uint)bVar66 * auVar92._24_4_ | (uint)!bVar66 * 2;
        local_6a0._28_4_ = (uint)(bVar62 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2;
        local_700 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_700,local_6a0,5);
        local_740 = auVar81._0_4_ + (float)local_820._0_4_;
        fStack_73c = auVar81._4_4_ + (float)local_820._4_4_;
        fStack_738 = auVar81._8_4_ + fStack_818;
        fStack_734 = auVar81._12_4_ + fStack_814;
        fStack_730 = auVar81._16_4_ + fStack_810;
        fStack_72c = auVar81._20_4_ + fStack_80c;
        fStack_728 = auVar81._24_4_ + fStack_808;
        fStack_724 = auVar81._28_4_ + fStack_804;
        _local_6e0 = _local_760;
        for (bVar62 = (byte)uVar14 & bVar61; auVar92 = _local_6e0, bVar62 != 0;
            bVar62 = ~bVar64 & bVar62 & (byte)uVar14) {
          auVar158._8_4_ = 0x7f800000;
          auVar158._0_8_ = 0x7f8000007f800000;
          auVar158._12_4_ = 0x7f800000;
          auVar158._16_4_ = 0x7f800000;
          auVar158._20_4_ = 0x7f800000;
          auVar158._24_4_ = 0x7f800000;
          auVar158._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar158,auVar81);
          auVar129._0_4_ =
               (uint)(bVar62 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 1 & 1);
          auVar129._4_4_ = (uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 2 & 1);
          auVar129._8_4_ = (uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 3 & 1);
          auVar129._12_4_ = (uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 4 & 1);
          auVar129._16_4_ = (uint)bVar66 * auVar92._16_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 5 & 1);
          auVar129._20_4_ = (uint)bVar66 * auVar92._20_4_ | (uint)!bVar66 * 0x7f800000;
          auVar129._24_4_ =
               (uint)(bVar62 >> 6) * auVar92._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar92 = vshufps_avx(auVar129,auVar129,0xb1);
          auVar92 = vminps_avx(auVar129,auVar92);
          auVar79 = vshufpd_avx(auVar92,auVar92,5);
          auVar92 = vminps_avx(auVar92,auVar79);
          auVar79 = vpermpd_avx2(auVar92,0x4e);
          auVar92 = vminps_avx(auVar92,auVar79);
          uVar14 = vcmpps_avx512vl(auVar129,auVar92,0);
          bVar58 = (byte)uVar14 & bVar62;
          bVar64 = bVar62;
          if (bVar58 != 0) {
            bVar64 = bVar58;
          }
          iVar17 = 0;
          for (uVar68 = (uint)bVar64; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          bVar64 = '\x01' << ((byte)iVar17 & 0x1f);
          uVar68 = *(uint *)(local_520 + (uint)(iVar17 << 2));
          uVar138 = *(uint *)(local_440 + (uint)(iVar17 << 2));
          fVar223 = auVar13._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar247 = ZEXT1664(auVar247._0_16_);
            auVar251 = ZEXT1664(auVar251._0_16_);
            auVar253 = ZEXT1664(auVar253._0_16_);
            fVar223 = sqrtf((float)local_a00._0_4_);
          }
          auVar242 = ZEXT464(uVar138);
          uVar67 = (ulong)bVar64;
          auVar71 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar69 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar1 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar70 = vminps_avx(auVar71,auVar1);
          auVar71 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar1 = vmaxps_avx(auVar69,auVar71);
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar69 = vandps_avx(auVar70,auVar203);
          auVar71 = vandps_avx(auVar1,auVar203);
          auVar69 = vmaxps_avx(auVar69,auVar71);
          auVar71 = vmovshdup_avx(auVar69);
          auVar71 = vmaxss_avx(auVar71,auVar69);
          auVar69 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxss_avx(auVar69,auVar71);
          fVar202 = auVar69._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar1,auVar1,0xff);
          auVar69 = vinsertps_avx(ZEXT416(uVar138),ZEXT416(uVar68),0x10);
          auVar163 = ZEXT1664(auVar69);
          uVar63 = 0;
          while( true ) {
            bVar58 = (byte)uVar67;
            if (uVar63 == 5) break;
            uVar164 = auVar163._0_4_;
            auVar147._4_4_ = uVar164;
            auVar147._0_4_ = uVar164;
            auVar147._8_4_ = uVar164;
            auVar147._12_4_ = uVar164;
            auVar69 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_9f0);
            auVar71 = vmovshdup_avx(auVar163._0_16_);
            fVar235 = auVar71._0_4_;
            fVar201 = 1.0 - fVar235;
            fVar218 = fVar235 * fVar235;
            auVar73 = SUB6416(ZEXT464(0x40400000),0);
            auVar72 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar70 = vfmadd213ss_fma(auVar73,auVar71,auVar72);
            auVar1 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar218),SUB6416(ZEXT464(0x40000000),0));
            auVar78 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar201),auVar72);
            auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)(fVar201 * fVar201)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar219 = fVar201 * fVar201 * -fVar235 * 0.5;
            fVar220 = auVar1._0_4_ * 0.5;
            fVar221 = auVar78._0_4_ * 0.5;
            fVar222 = fVar235 * fVar235 * -fVar201 * 0.5;
            auVar204._0_4_ = fVar222 * (float)local_9e0._0_4_;
            auVar204._4_4_ = fVar222 * (float)local_9e0._4_4_;
            auVar204._8_4_ = fVar222 * fStack_9d8;
            auVar204._12_4_ = fVar222 * fStack_9d4;
            auVar224._4_4_ = fVar221;
            auVar224._0_4_ = fVar221;
            auVar224._8_4_ = fVar221;
            auVar224._12_4_ = fVar221;
            auVar1 = vfmadd132ps_fma(auVar224,auVar204,local_9a0._0_16_);
            auVar182._4_4_ = fVar220;
            auVar182._0_4_ = fVar220;
            auVar182._8_4_ = fVar220;
            auVar182._12_4_ = fVar220;
            auVar1 = vfmadd132ps_fma(auVar182,auVar1,local_9c0._0_16_);
            auVar205._4_4_ = fVar219;
            auVar205._0_4_ = fVar219;
            auVar205._8_4_ = fVar219;
            auVar205._12_4_ = fVar219;
            auVar1 = vfmadd132ps_fma(auVar205,auVar1,local_980._0_16_);
            auVar78 = vfmadd231ss_fma(auVar72,auVar71,ZEXT416(0x41100000));
            local_8c0._0_16_ = auVar78;
            auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar71,ZEXT416(0x40800000));
            local_8e0._0_16_ = auVar78;
            auVar78 = vfmadd213ss_fma(auVar73,auVar71,ZEXT416(0xbf800000));
            local_900._0_16_ = auVar78;
            _local_8a0 = auVar1;
            auVar1 = vsubps_avx(auVar69,auVar1);
            auVar69 = vdpps_avx(auVar1,auVar1,0x7f);
            fVar219 = auVar69._0_4_;
            local_800 = auVar163;
            if (fVar219 < 0.0) {
              local_a20._0_4_ = fVar218;
              local_a40._0_4_ = fVar201 * -2.0;
              auVar253._0_4_ = sqrtf(fVar219);
              auVar253._4_60_ = extraout_var;
              auVar70 = ZEXT416(auVar70._0_4_);
              auVar78 = auVar253._0_16_;
              uVar67 = extraout_RAX;
            }
            else {
              auVar78 = vsqrtss_avx(auVar69,auVar69);
              local_a40._0_4_ = fVar201 * -2.0;
              local_a20._0_4_ = fVar218;
            }
            auVar74 = vfnmadd231ss_fma(ZEXT416((uint)(fVar235 * (fVar201 + fVar201))),
                                       ZEXT416((uint)fVar201),ZEXT416((uint)fVar201));
            auVar70 = vfmadd213ss_fma(auVar70,ZEXT416((uint)(fVar235 + fVar235)),
                                      ZEXT416((uint)(fVar235 * fVar235 * 3.0)));
            auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar71,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * fVar201 * -3.0)),
                                      ZEXT416((uint)(fVar201 + fVar201)),auVar72);
            auVar72 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar71,
                                      ZEXT416((uint)local_a20._0_4_));
            fVar218 = auVar74._0_4_ * 0.5;
            fVar220 = auVar70._0_4_ * 0.5;
            fVar221 = auVar73._0_4_ * 0.5;
            fVar222 = auVar72._0_4_ * 0.5;
            auVar206._0_4_ = fVar222 * (float)local_9e0._0_4_;
            auVar206._4_4_ = fVar222 * (float)local_9e0._4_4_;
            auVar206._8_4_ = fVar222 * fStack_9d8;
            auVar206._12_4_ = fVar222 * fStack_9d4;
            auVar183._4_4_ = fVar221;
            auVar183._0_4_ = fVar221;
            auVar183._8_4_ = fVar221;
            auVar183._12_4_ = fVar221;
            auVar70 = vfmadd132ps_fma(auVar183,auVar206,local_9a0._0_16_);
            auVar165._4_4_ = fVar220;
            auVar165._0_4_ = fVar220;
            auVar165._8_4_ = fVar220;
            auVar165._12_4_ = fVar220;
            auVar70 = vfmadd132ps_fma(auVar165,auVar70,local_9c0._0_16_);
            auVar255._4_4_ = fVar218;
            auVar255._0_4_ = fVar218;
            auVar255._8_4_ = fVar218;
            auVar255._12_4_ = fVar218;
            auVar70 = vfmadd132ps_fma(auVar255,auVar70,local_980._0_16_);
            local_a20._0_16_ = vdpps_avx(auVar70,auVar70,0x7f);
            auVar51._12_4_ = 0;
            auVar51._0_12_ = ZEXT812(0);
            fVar218 = local_a20._0_4_;
            auVar72 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar218));
            fVar220 = auVar72._0_4_;
            local_a40._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar218));
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar73 = vxorps_avx512vl(local_a20._0_16_,auVar19);
            auVar72 = vfnmadd213ss_fma(local_a40._0_16_,local_a20._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            uVar68 = auVar78._0_4_;
            if (fVar218 < auVar73._0_4_) {
              fVar221 = sqrtf(fVar218);
              auVar78 = ZEXT416(uVar68);
              uVar67 = extraout_RAX_00;
            }
            else {
              auVar73 = vsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
              fVar221 = auVar73._0_4_;
            }
            fVar218 = fVar220 * 1.5 + fVar218 * -0.5 * fVar220 * fVar220 * fVar220;
            auVar148._0_4_ = auVar70._0_4_ * fVar218;
            auVar148._4_4_ = auVar70._4_4_ * fVar218;
            auVar148._8_4_ = auVar70._8_4_ * fVar218;
            auVar148._12_4_ = auVar70._12_4_ * fVar218;
            auVar73 = vdpps_avx(auVar1,auVar148,0x7f);
            fVar201 = auVar78._0_4_;
            fVar220 = auVar73._0_4_;
            auVar149._0_4_ = fVar220 * fVar220;
            auVar149._4_4_ = auVar73._4_4_ * auVar73._4_4_;
            auVar149._8_4_ = auVar73._8_4_ * auVar73._8_4_;
            auVar149._12_4_ = auVar73._12_4_ * auVar73._12_4_;
            auVar74 = vsubps_avx512vl(auVar69,auVar149);
            fVar222 = auVar74._0_4_;
            auVar166._4_12_ = ZEXT812(0) << 0x20;
            auVar166._0_4_ = fVar222;
            auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
            auVar76 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
            if (fVar222 < 0.0) {
              local_930 = fVar218;
              fStack_92c = fVar218;
              fStack_928 = fVar218;
              fStack_924 = fVar218;
              local_920 = auVar75;
              fVar222 = sqrtf(fVar222);
              auVar76 = ZEXT416(auVar76._0_4_);
              auVar78 = ZEXT416(uVar68);
              uVar67 = extraout_RAX_01;
              auVar74 = local_920;
              fVar218 = local_930;
              fVar235 = fStack_92c;
              fVar236 = fStack_928;
              fVar237 = fStack_924;
            }
            else {
              auVar74 = vsqrtss_avx(auVar74,auVar74);
              fVar222 = auVar74._0_4_;
              auVar74 = auVar75;
              fVar235 = fVar218;
              fVar236 = fVar218;
              fVar237 = fVar218;
            }
            auVar251 = ZEXT1664(auVar1);
            auVar167._0_4_ = (float)local_900._0_4_ * (float)local_9e0._0_4_;
            auVar167._4_4_ = (float)local_900._0_4_ * (float)local_9e0._4_4_;
            auVar167._8_4_ = (float)local_900._0_4_ * fStack_9d8;
            auVar167._12_4_ = (float)local_900._0_4_ * fStack_9d4;
            auVar184._4_4_ = local_8e0._0_4_;
            auVar184._0_4_ = local_8e0._0_4_;
            auVar184._8_4_ = local_8e0._0_4_;
            auVar184._12_4_ = local_8e0._0_4_;
            auVar233 = vfmadd132ps_fma(auVar184,auVar167,local_9a0._0_16_);
            auVar168._4_4_ = local_8c0._0_4_;
            auVar168._0_4_ = local_8c0._0_4_;
            auVar168._8_4_ = local_8c0._0_4_;
            auVar168._12_4_ = local_8c0._0_4_;
            auVar233 = vfmadd132ps_fma(auVar168,auVar233,local_9c0._0_16_);
            auVar71 = vfmadd213ss_fma(auVar71,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar164 = auVar71._0_4_;
            auVar185._4_4_ = uVar164;
            auVar185._0_4_ = uVar164;
            auVar185._8_4_ = uVar164;
            auVar185._12_4_ = uVar164;
            auVar71 = vfmadd132ps_fma(auVar185,auVar233,local_980._0_16_);
            auVar169._0_4_ = auVar71._0_4_ * (float)local_a20._0_4_;
            auVar169._4_4_ = auVar71._4_4_ * (float)local_a20._0_4_;
            auVar169._8_4_ = auVar71._8_4_ * (float)local_a20._0_4_;
            auVar169._12_4_ = auVar71._12_4_ * (float)local_a20._0_4_;
            auVar71 = vdpps_avx(auVar70,auVar71,0x7f);
            fVar181 = auVar71._0_4_;
            auVar186._0_4_ = auVar70._0_4_ * fVar181;
            auVar186._4_4_ = auVar70._4_4_ * fVar181;
            auVar186._8_4_ = auVar70._8_4_ * fVar181;
            auVar186._12_4_ = auVar70._12_4_ * fVar181;
            auVar71 = vsubps_avx(auVar169,auVar186);
            fVar181 = auVar72._0_4_ * (float)local_a40._0_4_;
            auVar233 = vmaxss_avx(ZEXT416((uint)fVar202),
                                  ZEXT416((uint)(local_800._0_4_ * fVar223 * 1.9073486e-06)));
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar133._16_48_ = local_800._16_48_;
            auVar77 = vxorps_avx512vl(auVar70,auVar20);
            auVar187._0_4_ = fVar218 * auVar71._0_4_ * fVar181;
            auVar187._4_4_ = fVar235 * auVar71._4_4_ * fVar181;
            auVar187._8_4_ = fVar236 * auVar71._8_4_ * fVar181;
            auVar187._12_4_ = fVar237 * auVar71._12_4_ * fVar181;
            auVar253 = ZEXT1664(auVar148);
            auVar71 = vdpps_avx(auVar77,auVar148,0x7f);
            auVar72 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar202),auVar233);
            auVar78 = vdpps_avx(auVar1,auVar187,0x7f);
            auVar254 = vfmadd213ss_fma(ZEXT416((uint)(fVar201 + 1.0)),
                                       ZEXT416((uint)(fVar202 / fVar221)),auVar72);
            fVar218 = auVar71._0_4_ + auVar78._0_4_;
            auVar71 = vdpps_avx(local_9f0,auVar148,0x7f);
            auVar78 = vdpps_avx(auVar1,auVar77,0x7f);
            auVar72 = vmulss_avx512f(auVar76,auVar74);
            fVar221 = auVar75._0_4_ * 1.5 + auVar72._0_4_ * auVar74._0_4_ * auVar74._0_4_;
            auVar72 = vdpps_avx(auVar1,local_9f0,0x7f);
            auVar75 = vfnmadd231ss_fma(auVar78,auVar73,ZEXT416((uint)fVar218));
            auVar72 = vfnmadd231ss_fma(auVar72,auVar73,auVar71);
            auVar78 = vpermilps_avx(_local_8a0,0xff);
            fVar222 = fVar222 - auVar78._0_4_;
            auVar74 = vshufps_avx(auVar70,auVar70,0xff);
            auVar78 = vfmsub213ss_fma(auVar75,ZEXT416((uint)fVar221),auVar74);
            auVar244._8_4_ = 0x80000000;
            auVar244._0_8_ = 0x8000000080000000;
            auVar244._12_4_ = 0x80000000;
            auVar247 = ZEXT1664(auVar244);
            auVar239._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar239._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar239._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar242 = ZEXT1664(auVar239);
            auVar72 = ZEXT416((uint)(auVar72._0_4_ * fVar221));
            auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar78._0_4_)),
                                      ZEXT416((uint)fVar218),auVar72);
            auVar78 = vinsertps_avx(auVar239,auVar72,0x1c);
            auVar229._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
            auVar229._8_4_ = auVar71._8_4_ ^ 0x80000000;
            auVar229._12_4_ = auVar71._12_4_ ^ 0x80000000;
            auVar72 = vinsertps_avx(ZEXT416((uint)fVar218),auVar229,0x10);
            auVar207._0_4_ = auVar75._0_4_;
            auVar207._4_4_ = auVar207._0_4_;
            auVar207._8_4_ = auVar207._0_4_;
            auVar207._12_4_ = auVar207._0_4_;
            auVar71 = vdivps_avx(auVar78,auVar207);
            auVar78 = vdivps_avx(auVar72,auVar207);
            auVar208._0_4_ = fVar220 * auVar71._0_4_ + fVar222 * auVar78._0_4_;
            auVar208._4_4_ = fVar220 * auVar71._4_4_ + fVar222 * auVar78._4_4_;
            auVar208._8_4_ = fVar220 * auVar71._8_4_ + fVar222 * auVar78._8_4_;
            auVar208._12_4_ = fVar220 * auVar71._12_4_ + fVar222 * auVar78._12_4_;
            auVar71 = vsubps_avx(local_800._0_16_,auVar208);
            auVar163 = ZEXT1664(auVar71);
            auVar21._8_4_ = 0x7fffffff;
            auVar21._0_8_ = 0x7fffffff7fffffff;
            auVar21._12_4_ = 0x7fffffff;
            auVar78 = vandps_avx512vl(auVar73,auVar21);
            if (auVar78._0_4_ < auVar254._0_4_) {
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar254._0_4_ + auVar233._0_4_)),local_940,
                                        ZEXT416(0x36000000));
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(ZEXT416((uint)fVar222),auVar22);
              if (auVar72._0_4_ < auVar78._0_4_) {
                bVar66 = uVar63 < 5;
                fVar223 = auVar71._0_4_ + (float)local_950._0_4_;
                if ((fVar145 <= fVar223) &&
                   (fVar202 = *(float *)(ray + k * 4 + 0x200), fVar223 <= fVar202)) {
                  auVar71 = vmovshdup_avx(auVar71);
                  bVar58 = 0;
                  if ((auVar71._0_4_ < 0.0) || (1.0 < auVar71._0_4_)) goto LAB_01a4cda0;
                  auVar209._0_12_ = ZEXT812(0);
                  auVar209._12_4_ = 0;
                  auVar133._0_16_ = auVar209;
                  auVar132._4_60_ = auVar133._4_60_;
                  auVar132._0_4_ = fVar219;
                  auVar71 = vrsqrt14ss_avx512f(auVar209,auVar132._0_16_);
                  fVar218 = auVar71._0_4_;
                  auVar69 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
                  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01a4cda0;
                    fVar218 = fVar218 * 1.5 + auVar69._0_4_ * fVar218 * fVar218 * fVar218;
                    auVar188._0_4_ = auVar1._0_4_ * fVar218;
                    auVar188._4_4_ = auVar1._4_4_ * fVar218;
                    auVar188._8_4_ = auVar1._8_4_ * fVar218;
                    auVar188._12_4_ = auVar1._12_4_ * fVar218;
                    auVar78 = vfmadd213ps_fma(auVar74,auVar188,auVar70);
                    auVar69 = vshufps_avx(auVar188,auVar188,0xc9);
                    auVar71 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar189._0_4_ = auVar188._0_4_ * auVar71._0_4_;
                    auVar189._4_4_ = auVar188._4_4_ * auVar71._4_4_;
                    auVar189._8_4_ = auVar188._8_4_ * auVar71._8_4_;
                    auVar189._12_4_ = auVar188._12_4_ * auVar71._12_4_;
                    auVar70 = vfmsub231ps_fma(auVar189,auVar70,auVar69);
                    auVar69 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar71 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                    auVar150._0_4_ = auVar78._0_4_ * auVar70._0_4_;
                    auVar150._4_4_ = auVar78._4_4_ * auVar70._4_4_;
                    auVar150._8_4_ = auVar78._8_4_ * auVar70._8_4_;
                    auVar150._12_4_ = auVar78._12_4_ * auVar70._12_4_;
                    auVar69 = vfmsub231ps_fma(auVar150,auVar69,auVar71);
                    auVar260 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar260,auVar163);
                    auVar163 = vpermps_avx512f(auVar260,ZEXT1664(auVar69));
                    auVar260 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar260,ZEXT1664(auVar69));
                    local_380 = vbroadcastss_avx512f(auVar69);
                    local_400[0] = (RTCHitN)auVar163[0];
                    local_400[1] = (RTCHitN)auVar163[1];
                    local_400[2] = (RTCHitN)auVar163[2];
                    local_400[3] = (RTCHitN)auVar163[3];
                    local_400[4] = (RTCHitN)auVar163[4];
                    local_400[5] = (RTCHitN)auVar163[5];
                    local_400[6] = (RTCHitN)auVar163[6];
                    local_400[7] = (RTCHitN)auVar163[7];
                    local_400[8] = (RTCHitN)auVar163[8];
                    local_400[9] = (RTCHitN)auVar163[9];
                    local_400[10] = (RTCHitN)auVar163[10];
                    local_400[0xb] = (RTCHitN)auVar163[0xb];
                    local_400[0xc] = (RTCHitN)auVar163[0xc];
                    local_400[0xd] = (RTCHitN)auVar163[0xd];
                    local_400[0xe] = (RTCHitN)auVar163[0xe];
                    local_400[0xf] = (RTCHitN)auVar163[0xf];
                    local_400[0x10] = (RTCHitN)auVar163[0x10];
                    local_400[0x11] = (RTCHitN)auVar163[0x11];
                    local_400[0x12] = (RTCHitN)auVar163[0x12];
                    local_400[0x13] = (RTCHitN)auVar163[0x13];
                    local_400[0x14] = (RTCHitN)auVar163[0x14];
                    local_400[0x15] = (RTCHitN)auVar163[0x15];
                    local_400[0x16] = (RTCHitN)auVar163[0x16];
                    local_400[0x17] = (RTCHitN)auVar163[0x17];
                    local_400[0x18] = (RTCHitN)auVar163[0x18];
                    local_400[0x19] = (RTCHitN)auVar163[0x19];
                    local_400[0x1a] = (RTCHitN)auVar163[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar163[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar163[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar163[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar163[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar163[0x1f];
                    local_400[0x20] = (RTCHitN)auVar163[0x20];
                    local_400[0x21] = (RTCHitN)auVar163[0x21];
                    local_400[0x22] = (RTCHitN)auVar163[0x22];
                    local_400[0x23] = (RTCHitN)auVar163[0x23];
                    local_400[0x24] = (RTCHitN)auVar163[0x24];
                    local_400[0x25] = (RTCHitN)auVar163[0x25];
                    local_400[0x26] = (RTCHitN)auVar163[0x26];
                    local_400[0x27] = (RTCHitN)auVar163[0x27];
                    local_400[0x28] = (RTCHitN)auVar163[0x28];
                    local_400[0x29] = (RTCHitN)auVar163[0x29];
                    local_400[0x2a] = (RTCHitN)auVar163[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar163[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar163[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar163[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar163[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar163[0x2f];
                    local_400[0x30] = (RTCHitN)auVar163[0x30];
                    local_400[0x31] = (RTCHitN)auVar163[0x31];
                    local_400[0x32] = (RTCHitN)auVar163[0x32];
                    local_400[0x33] = (RTCHitN)auVar163[0x33];
                    local_400[0x34] = (RTCHitN)auVar163[0x34];
                    local_400[0x35] = (RTCHitN)auVar163[0x35];
                    local_400[0x36] = (RTCHitN)auVar163[0x36];
                    local_400[0x37] = (RTCHitN)auVar163[0x37];
                    local_400[0x38] = (RTCHitN)auVar163[0x38];
                    local_400[0x39] = (RTCHitN)auVar163[0x39];
                    local_400[0x3a] = (RTCHitN)auVar163[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar163[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar163[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar163[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar163[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar163[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar163 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar163);
                    vpcmpeqd_avx2(auVar163._0_32_,auVar163._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar223;
                    auVar163 = vmovdqa64_avx512f(local_500);
                    local_7c0 = vmovdqa64_avx512f(auVar163);
                    local_a70.valid = (int *)local_7c0;
                    local_a70.geometryUserPtr = pGVar3->userPtr;
                    local_a70.context = context->user;
                    local_a70.hit = local_400;
                    local_a70.N = 0x10;
                    local_a70.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar242 = ZEXT1664(auVar239);
                      auVar247 = ZEXT1664(auVar244);
                      auVar251 = ZEXT1664(auVar1);
                      auVar253 = ZEXT1664(auVar148);
                      (*pGVar3->occlusionFilterN)(&local_a70);
                      auVar163 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar14 = vptestmd_avx512f(auVar163,auVar163);
                    if ((short)uVar14 != 0) {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        (*p_Var4)(&local_a70);
                        auVar163 = vmovdqa64_avx512f(local_7c0);
                      }
                      uVar67 = vptestmd_avx512f(auVar163,auVar163);
                      auVar163 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar5 = (bool)((byte)uVar67 & 1);
                      auVar134._0_4_ =
                           (uint)bVar5 * auVar163._0_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x200);
                      bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
                      auVar134._4_4_ =
                           (uint)bVar5 * auVar163._4_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x204);
                      bVar5 = (bool)((byte)(uVar67 >> 2) & 1);
                      auVar134._8_4_ =
                           (uint)bVar5 * auVar163._8_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x208);
                      bVar5 = (bool)((byte)(uVar67 >> 3) & 1);
                      auVar134._12_4_ =
                           (uint)bVar5 * auVar163._12_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x20c);
                      bVar5 = (bool)((byte)(uVar67 >> 4) & 1);
                      auVar134._16_4_ =
                           (uint)bVar5 * auVar163._16_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x210);
                      bVar5 = (bool)((byte)(uVar67 >> 5) & 1);
                      auVar134._20_4_ =
                           (uint)bVar5 * auVar163._20_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x214);
                      bVar5 = (bool)((byte)(uVar67 >> 6) & 1);
                      auVar134._24_4_ =
                           (uint)bVar5 * auVar163._24_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x218);
                      bVar5 = (bool)((byte)(uVar67 >> 7) & 1);
                      auVar134._28_4_ =
                           (uint)bVar5 * auVar163._28_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x21c);
                      bVar5 = (bool)((byte)(uVar67 >> 8) & 1);
                      auVar134._32_4_ =
                           (uint)bVar5 * auVar163._32_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x220);
                      bVar5 = (bool)((byte)(uVar67 >> 9) & 1);
                      auVar134._36_4_ =
                           (uint)bVar5 * auVar163._36_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x224);
                      bVar5 = (bool)((byte)(uVar67 >> 10) & 1);
                      auVar134._40_4_ =
                           (uint)bVar5 * auVar163._40_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x228);
                      bVar5 = (bool)((byte)(uVar67 >> 0xb) & 1);
                      auVar134._44_4_ =
                           (uint)bVar5 * auVar163._44_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x22c);
                      bVar5 = (bool)((byte)(uVar67 >> 0xc) & 1);
                      auVar134._48_4_ =
                           (uint)bVar5 * auVar163._48_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x230);
                      bVar5 = (bool)((byte)(uVar67 >> 0xd) & 1);
                      auVar134._52_4_ =
                           (uint)bVar5 * auVar163._52_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x234);
                      bVar5 = (bool)((byte)(uVar67 >> 0xe) & 1);
                      auVar134._56_4_ =
                           (uint)bVar5 * auVar163._56_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x238);
                      bVar5 = SUB81(uVar67 >> 0xf,0);
                      auVar134._60_4_ =
                           (uint)bVar5 * auVar163._60_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x23c);
                      *(undefined1 (*) [64])(local_a70.ray + 0x200) = auVar134;
                      bVar58 = 1;
                      if ((short)uVar67 != 0) goto LAB_01a4cda0;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar202;
                    bVar58 = 0;
                    goto LAB_01a4cda0;
                  }
                }
                bVar58 = 0;
                goto LAB_01a4cda0;
              }
            }
            uVar63 = uVar63 + 1;
          }
          bVar66 = false;
LAB_01a4cda0:
          bVar59 = bVar59 | bVar66 & bVar58;
          uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar231._4_4_ = uVar164;
          auVar231._0_4_ = uVar164;
          auVar231._8_4_ = uVar164;
          auVar231._12_4_ = uVar164;
          auVar231._16_4_ = uVar164;
          auVar231._20_4_ = uVar164;
          auVar231._24_4_ = uVar164;
          auVar231._28_4_ = uVar164;
          auVar163 = ZEXT3264(auVar231);
          auVar53._4_4_ = fStack_73c;
          auVar53._0_4_ = local_740;
          auVar53._8_4_ = fStack_738;
          auVar53._12_4_ = fStack_734;
          auVar53._16_4_ = fStack_730;
          auVar53._20_4_ = fStack_72c;
          auVar53._24_4_ = fStack_728;
          auVar53._28_4_ = fStack_724;
          uVar14 = vcmpps_avx512vl(auVar231,auVar53,0xd);
        }
        auVar159._0_4_ = (float)local_820._0_4_ + (float)local_760._0_4_;
        auVar159._4_4_ = (float)local_820._4_4_ + (float)local_760._4_4_;
        auVar159._8_4_ = fStack_818 + fStack_758;
        auVar159._12_4_ = fStack_814 + fStack_754;
        auVar159._16_4_ = fStack_810 + fStack_750;
        auVar159._20_4_ = fStack_80c + fStack_74c;
        auVar159._24_4_ = fStack_808 + fStack_748;
        auVar159._28_4_ = fStack_804 + fStack_744;
        uVar164 = auVar163._0_4_;
        auVar177._4_4_ = uVar164;
        auVar177._0_4_ = uVar164;
        auVar177._8_4_ = uVar164;
        auVar177._12_4_ = uVar164;
        auVar177._16_4_ = uVar164;
        auVar177._20_4_ = uVar164;
        auVar177._24_4_ = uVar164;
        auVar177._28_4_ = uVar164;
        uVar14 = vcmpps_avx512vl(auVar159,auVar177,2);
        auVar160._8_4_ = 2;
        auVar160._0_8_ = 0x200000002;
        auVar160._12_4_ = 2;
        auVar160._16_4_ = 2;
        auVar160._20_4_ = 2;
        auVar160._24_4_ = 2;
        auVar160._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar81 = vpblendmd_avx512vl(auVar160,auVar32);
        local_760._0_4_ = (uint)(bVar57 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
        bVar66 = (bool)(bVar57 >> 1 & 1);
        local_760._4_4_ = (uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar57 >> 2 & 1);
        fStack_758 = (float)((uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar57 >> 3 & 1);
        fStack_754 = (float)((uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar57 >> 4 & 1);
        fStack_750 = (float)((uint)bVar66 * auVar81._16_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar57 >> 5 & 1);
        fStack_74c = (float)((uint)bVar66 * auVar81._20_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar57 >> 6 & 1);
        fStack_748 = (float)((uint)bVar66 * auVar81._24_4_ | (uint)!bVar66 * 2);
        fStack_744 = (float)((uint)(bVar57 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2);
        bVar56 = (byte)uVar15 & bVar56 & (byte)uVar14;
        uVar14 = vpcmpd_avx512vl(_local_760,local_700,2);
        local_740 = (float)local_820._0_4_ + (float)local_6e0._0_4_;
        fStack_73c = (float)local_820._4_4_ + (float)local_6e0._4_4_;
        fStack_738 = fStack_818 + fStack_6d8;
        fStack_734 = fStack_814 + fStack_6d4;
        fStack_730 = fStack_810 + fStack_6d0;
        fStack_72c = fStack_80c + fStack_6cc;
        fStack_728 = fStack_808 + fStack_6c8;
        fStack_724 = fStack_804 + fStack_6c4;
        for (bVar62 = (byte)uVar14 & bVar56; bVar62 != 0; bVar62 = ~bVar57 & bVar62 & (byte)uVar14)
        {
          auVar161._8_4_ = 0x7f800000;
          auVar161._0_8_ = 0x7f8000007f800000;
          auVar161._12_4_ = 0x7f800000;
          auVar161._16_4_ = 0x7f800000;
          auVar161._20_4_ = 0x7f800000;
          auVar161._24_4_ = 0x7f800000;
          auVar161._28_4_ = 0x7f800000;
          auVar81 = vblendmps_avx512vl(auVar161,auVar92);
          auVar130._0_4_ =
               (uint)(bVar62 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 1 & 1);
          auVar130._4_4_ = (uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 2 & 1);
          auVar130._8_4_ = (uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 3 & 1);
          auVar130._12_4_ = (uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 4 & 1);
          auVar130._16_4_ = (uint)bVar66 * auVar81._16_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 5 & 1);
          auVar130._20_4_ = (uint)bVar66 * auVar81._20_4_ | (uint)!bVar66 * 0x7f800000;
          auVar130._24_4_ =
               (uint)(bVar62 >> 6) * auVar81._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar81 = vshufps_avx(auVar130,auVar130,0xb1);
          auVar81 = vminps_avx(auVar130,auVar81);
          auVar79 = vshufpd_avx(auVar81,auVar81,5);
          auVar81 = vminps_avx(auVar81,auVar79);
          auVar79 = vpermpd_avx2(auVar81,0x4e);
          auVar81 = vminps_avx(auVar81,auVar79);
          uVar14 = vcmpps_avx512vl(auVar130,auVar81,0);
          bVar64 = (byte)uVar14 & bVar62;
          bVar57 = bVar62;
          if (bVar64 != 0) {
            bVar57 = bVar64;
          }
          iVar17 = 0;
          for (uVar68 = (uint)bVar57; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          bVar57 = '\x01' << ((byte)iVar17 & 0x1f);
          uVar68 = *(uint *)(local_540 + (uint)(iVar17 << 2));
          uVar138 = *(uint *)(local_6c0 + (uint)(iVar17 << 2));
          fVar223 = auVar12._0_4_;
          if ((float)local_a00._0_4_ < 0.0) {
            auVar247 = ZEXT1664(auVar247._0_16_);
            auVar251 = ZEXT1664(auVar251._0_16_);
            auVar253 = ZEXT1664(auVar253._0_16_);
            fVar223 = sqrtf((float)local_a00._0_4_);
          }
          auVar242 = ZEXT464(uVar138);
          uVar67 = (ulong)bVar57;
          auVar71 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar69 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar1 = vminps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar70 = vminps_avx(auVar71,auVar1);
          auVar71 = vmaxps_avx(local_9a0._0_16_,local_9e0._0_16_);
          auVar1 = vmaxps_avx(auVar69,auVar71);
          auVar210._8_4_ = 0x7fffffff;
          auVar210._0_8_ = 0x7fffffff7fffffff;
          auVar210._12_4_ = 0x7fffffff;
          auVar69 = vandps_avx(auVar70,auVar210);
          auVar71 = vandps_avx(auVar1,auVar210);
          auVar69 = vmaxps_avx(auVar69,auVar71);
          auVar71 = vmovshdup_avx(auVar69);
          auVar71 = vmaxss_avx(auVar71,auVar69);
          auVar69 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxss_avx(auVar69,auVar71);
          fVar202 = auVar69._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar1,auVar1,0xff);
          auVar69 = vinsertps_avx(ZEXT416(uVar138),ZEXT416(uVar68),0x10);
          auVar163 = ZEXT1664(auVar69);
          uVar63 = 0;
          while( true ) {
            bVar64 = (byte)uVar67;
            if (uVar63 == 5) break;
            uVar164 = auVar163._0_4_;
            auVar151._4_4_ = uVar164;
            auVar151._0_4_ = uVar164;
            auVar151._8_4_ = uVar164;
            auVar151._12_4_ = uVar164;
            auVar69 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_9f0);
            auVar71 = vmovshdup_avx(auVar163._0_16_);
            fVar235 = auVar71._0_4_;
            fVar201 = 1.0 - fVar235;
            fVar218 = fVar235 * fVar235;
            auVar73 = SUB6416(ZEXT464(0x40400000),0);
            auVar72 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar70 = vfmadd213ss_fma(auVar73,auVar71,auVar72);
            auVar1 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar218),SUB6416(ZEXT464(0x40000000),0));
            auVar78 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar201),auVar72);
            auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)(fVar201 * fVar201)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar219 = fVar201 * fVar201 * -fVar235 * 0.5;
            fVar220 = auVar1._0_4_ * 0.5;
            fVar221 = auVar78._0_4_ * 0.5;
            fVar222 = fVar235 * fVar235 * -fVar201 * 0.5;
            auVar211._0_4_ = fVar222 * (float)local_9e0._0_4_;
            auVar211._4_4_ = fVar222 * (float)local_9e0._4_4_;
            auVar211._8_4_ = fVar222 * fStack_9d8;
            auVar211._12_4_ = fVar222 * fStack_9d4;
            auVar225._4_4_ = fVar221;
            auVar225._0_4_ = fVar221;
            auVar225._8_4_ = fVar221;
            auVar225._12_4_ = fVar221;
            auVar1 = vfmadd132ps_fma(auVar225,auVar211,local_9a0._0_16_);
            auVar190._4_4_ = fVar220;
            auVar190._0_4_ = fVar220;
            auVar190._8_4_ = fVar220;
            auVar190._12_4_ = fVar220;
            auVar1 = vfmadd132ps_fma(auVar190,auVar1,local_9c0._0_16_);
            auVar212._4_4_ = fVar219;
            auVar212._0_4_ = fVar219;
            auVar212._8_4_ = fVar219;
            auVar212._12_4_ = fVar219;
            auVar1 = vfmadd132ps_fma(auVar212,auVar1,local_980._0_16_);
            auVar78 = vfmadd231ss_fma(auVar72,auVar71,ZEXT416(0x41100000));
            local_8c0._0_16_ = auVar78;
            auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar71,ZEXT416(0x40800000));
            local_8e0._0_16_ = auVar78;
            auVar78 = vfmadd213ss_fma(auVar73,auVar71,ZEXT416(0xbf800000));
            local_900._0_16_ = auVar78;
            _local_8a0 = auVar1;
            auVar1 = vsubps_avx(auVar69,auVar1);
            auVar69 = vdpps_avx(auVar1,auVar1,0x7f);
            fVar219 = auVar69._0_4_;
            local_800 = auVar163;
            if (fVar219 < 0.0) {
              local_a20._0_4_ = fVar218;
              local_a40._0_4_ = fVar201 * -2.0;
              auVar251._0_4_ = sqrtf(fVar219);
              auVar251._4_60_ = extraout_var_00;
              auVar70 = ZEXT416(auVar70._0_4_);
              auVar78 = auVar251._0_16_;
              uVar67 = extraout_RAX_02;
            }
            else {
              auVar78 = vsqrtss_avx(auVar69,auVar69);
              local_a40._0_4_ = fVar201 * -2.0;
              local_a20._0_4_ = fVar218;
            }
            auVar74 = vfnmadd231ss_fma(ZEXT416((uint)(fVar235 * (fVar201 + fVar201))),
                                       ZEXT416((uint)fVar201),ZEXT416((uint)fVar201));
            auVar70 = vfmadd213ss_fma(auVar70,ZEXT416((uint)(fVar235 + fVar235)),
                                      ZEXT416((uint)(fVar235 * fVar235 * 3.0)));
            auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar71,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * fVar201 * -3.0)),
                                      ZEXT416((uint)(fVar201 + fVar201)),auVar72);
            auVar72 = vfmadd213ss_fma(ZEXT416((uint)local_a40._0_4_),auVar71,
                                      ZEXT416((uint)local_a20._0_4_));
            fVar218 = auVar74._0_4_ * 0.5;
            fVar220 = auVar70._0_4_ * 0.5;
            fVar221 = auVar73._0_4_ * 0.5;
            fVar222 = auVar72._0_4_ * 0.5;
            auVar213._0_4_ = fVar222 * (float)local_9e0._0_4_;
            auVar213._4_4_ = fVar222 * (float)local_9e0._4_4_;
            auVar213._8_4_ = fVar222 * fStack_9d8;
            auVar213._12_4_ = fVar222 * fStack_9d4;
            auVar191._4_4_ = fVar221;
            auVar191._0_4_ = fVar221;
            auVar191._8_4_ = fVar221;
            auVar191._12_4_ = fVar221;
            auVar70 = vfmadd132ps_fma(auVar191,auVar213,local_9a0._0_16_);
            auVar170._4_4_ = fVar220;
            auVar170._0_4_ = fVar220;
            auVar170._8_4_ = fVar220;
            auVar170._12_4_ = fVar220;
            auVar70 = vfmadd132ps_fma(auVar170,auVar70,local_9c0._0_16_);
            auVar256._4_4_ = fVar218;
            auVar256._0_4_ = fVar218;
            auVar256._8_4_ = fVar218;
            auVar256._12_4_ = fVar218;
            auVar70 = vfmadd132ps_fma(auVar256,auVar70,local_980._0_16_);
            local_a20._0_16_ = vdpps_avx(auVar70,auVar70,0x7f);
            auVar52._12_4_ = 0;
            auVar52._0_12_ = ZEXT812(0);
            fVar218 = local_a20._0_4_;
            auVar72 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar218));
            fVar220 = auVar72._0_4_;
            local_a40._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar218));
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar73 = vxorps_avx512vl(local_a20._0_16_,auVar23);
            auVar72 = vfnmadd213ss_fma(local_a40._0_16_,local_a20._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            uVar68 = auVar78._0_4_;
            if (fVar218 < auVar73._0_4_) {
              fVar221 = sqrtf(fVar218);
              auVar78 = ZEXT416(uVar68);
              uVar67 = extraout_RAX_03;
            }
            else {
              auVar73 = vsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
              fVar221 = auVar73._0_4_;
            }
            fVar218 = fVar220 * 1.5 + fVar218 * -0.5 * fVar220 * fVar220 * fVar220;
            auVar152._0_4_ = auVar70._0_4_ * fVar218;
            auVar152._4_4_ = auVar70._4_4_ * fVar218;
            auVar152._8_4_ = auVar70._8_4_ * fVar218;
            auVar152._12_4_ = auVar70._12_4_ * fVar218;
            auVar73 = vdpps_avx(auVar1,auVar152,0x7f);
            fVar201 = auVar78._0_4_;
            fVar220 = auVar73._0_4_;
            auVar153._0_4_ = fVar220 * fVar220;
            auVar153._4_4_ = auVar73._4_4_ * auVar73._4_4_;
            auVar153._8_4_ = auVar73._8_4_ * auVar73._8_4_;
            auVar153._12_4_ = auVar73._12_4_ * auVar73._12_4_;
            auVar74 = vsubps_avx512vl(auVar69,auVar153);
            fVar222 = auVar74._0_4_;
            auVar171._4_12_ = ZEXT812(0) << 0x20;
            auVar171._0_4_ = fVar222;
            auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
            auVar76 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
            if (fVar222 < 0.0) {
              local_930 = fVar218;
              fStack_92c = fVar218;
              fStack_928 = fVar218;
              fStack_924 = fVar218;
              local_920 = auVar75;
              fVar222 = sqrtf(fVar222);
              auVar76 = ZEXT416(auVar76._0_4_);
              auVar78 = ZEXT416(uVar68);
              uVar67 = extraout_RAX_04;
              auVar74 = local_920;
              fVar218 = local_930;
              fVar235 = fStack_92c;
              fVar236 = fStack_928;
              fVar237 = fStack_924;
            }
            else {
              auVar74 = vsqrtss_avx(auVar74,auVar74);
              fVar222 = auVar74._0_4_;
              auVar74 = auVar75;
              fVar235 = fVar218;
              fVar236 = fVar218;
              fVar237 = fVar218;
            }
            auVar251 = ZEXT1664(auVar1);
            auVar172._0_4_ = (float)local_900._0_4_ * (float)local_9e0._0_4_;
            auVar172._4_4_ = (float)local_900._0_4_ * (float)local_9e0._4_4_;
            auVar172._8_4_ = (float)local_900._0_4_ * fStack_9d8;
            auVar172._12_4_ = (float)local_900._0_4_ * fStack_9d4;
            auVar192._4_4_ = local_8e0._0_4_;
            auVar192._0_4_ = local_8e0._0_4_;
            auVar192._8_4_ = local_8e0._0_4_;
            auVar192._12_4_ = local_8e0._0_4_;
            auVar233 = vfmadd132ps_fma(auVar192,auVar172,local_9a0._0_16_);
            auVar173._4_4_ = local_8c0._0_4_;
            auVar173._0_4_ = local_8c0._0_4_;
            auVar173._8_4_ = local_8c0._0_4_;
            auVar173._12_4_ = local_8c0._0_4_;
            auVar233 = vfmadd132ps_fma(auVar173,auVar233,local_9c0._0_16_);
            auVar71 = vfmadd213ss_fma(auVar71,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar164 = auVar71._0_4_;
            auVar193._4_4_ = uVar164;
            auVar193._0_4_ = uVar164;
            auVar193._8_4_ = uVar164;
            auVar193._12_4_ = uVar164;
            auVar71 = vfmadd132ps_fma(auVar193,auVar233,local_980._0_16_);
            auVar174._0_4_ = auVar71._0_4_ * (float)local_a20._0_4_;
            auVar174._4_4_ = auVar71._4_4_ * (float)local_a20._0_4_;
            auVar174._8_4_ = auVar71._8_4_ * (float)local_a20._0_4_;
            auVar174._12_4_ = auVar71._12_4_ * (float)local_a20._0_4_;
            auVar71 = vdpps_avx(auVar70,auVar71,0x7f);
            fVar181 = auVar71._0_4_;
            auVar194._0_4_ = auVar70._0_4_ * fVar181;
            auVar194._4_4_ = auVar70._4_4_ * fVar181;
            auVar194._8_4_ = auVar70._8_4_ * fVar181;
            auVar194._12_4_ = auVar70._12_4_ * fVar181;
            auVar71 = vsubps_avx(auVar174,auVar194);
            fVar181 = auVar72._0_4_ * (float)local_a40._0_4_;
            auVar233 = vmaxss_avx(ZEXT416((uint)fVar202),
                                  ZEXT416((uint)(local_800._0_4_ * fVar223 * 1.9073486e-06)));
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar136._16_48_ = local_800._16_48_;
            auVar77 = vxorps_avx512vl(auVar70,auVar24);
            auVar195._0_4_ = fVar218 * auVar71._0_4_ * fVar181;
            auVar195._4_4_ = fVar235 * auVar71._4_4_ * fVar181;
            auVar195._8_4_ = fVar236 * auVar71._8_4_ * fVar181;
            auVar195._12_4_ = fVar237 * auVar71._12_4_ * fVar181;
            auVar253 = ZEXT1664(auVar152);
            auVar71 = vdpps_avx(auVar77,auVar152,0x7f);
            auVar72 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar202),auVar233);
            auVar78 = vdpps_avx(auVar1,auVar195,0x7f);
            auVar254 = vfmadd213ss_fma(ZEXT416((uint)(fVar201 + 1.0)),
                                       ZEXT416((uint)(fVar202 / fVar221)),auVar72);
            fVar218 = auVar71._0_4_ + auVar78._0_4_;
            auVar71 = vdpps_avx(local_9f0,auVar152,0x7f);
            auVar78 = vdpps_avx(auVar1,auVar77,0x7f);
            auVar72 = vmulss_avx512f(auVar76,auVar74);
            fVar221 = auVar75._0_4_ * 1.5 + auVar72._0_4_ * auVar74._0_4_ * auVar74._0_4_;
            auVar72 = vdpps_avx(auVar1,local_9f0,0x7f);
            auVar75 = vfnmadd231ss_fma(auVar78,auVar73,ZEXT416((uint)fVar218));
            auVar72 = vfnmadd231ss_fma(auVar72,auVar73,auVar71);
            auVar78 = vpermilps_avx(_local_8a0,0xff);
            fVar222 = fVar222 - auVar78._0_4_;
            auVar74 = vshufps_avx(auVar70,auVar70,0xff);
            auVar78 = vfmsub213ss_fma(auVar75,ZEXT416((uint)fVar221),auVar74);
            auVar245._8_4_ = 0x80000000;
            auVar245._0_8_ = 0x8000000080000000;
            auVar245._12_4_ = 0x80000000;
            auVar247 = ZEXT1664(auVar245);
            auVar240._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar240._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar240._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar242 = ZEXT1664(auVar240);
            auVar72 = ZEXT416((uint)(auVar72._0_4_ * fVar221));
            auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar78._0_4_)),
                                      ZEXT416((uint)fVar218),auVar72);
            auVar78 = vinsertps_avx(auVar240,auVar72,0x1c);
            auVar230._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
            auVar230._8_4_ = auVar71._8_4_ ^ 0x80000000;
            auVar230._12_4_ = auVar71._12_4_ ^ 0x80000000;
            auVar72 = vinsertps_avx(ZEXT416((uint)fVar218),auVar230,0x10);
            auVar214._0_4_ = auVar75._0_4_;
            auVar214._4_4_ = auVar214._0_4_;
            auVar214._8_4_ = auVar214._0_4_;
            auVar214._12_4_ = auVar214._0_4_;
            auVar71 = vdivps_avx(auVar78,auVar214);
            auVar78 = vdivps_avx(auVar72,auVar214);
            auVar215._0_4_ = fVar220 * auVar71._0_4_ + fVar222 * auVar78._0_4_;
            auVar215._4_4_ = fVar220 * auVar71._4_4_ + fVar222 * auVar78._4_4_;
            auVar215._8_4_ = fVar220 * auVar71._8_4_ + fVar222 * auVar78._8_4_;
            auVar215._12_4_ = fVar220 * auVar71._12_4_ + fVar222 * auVar78._12_4_;
            auVar71 = vsubps_avx(local_800._0_16_,auVar215);
            auVar163 = ZEXT1664(auVar71);
            auVar25._8_4_ = 0x7fffffff;
            auVar25._0_8_ = 0x7fffffff7fffffff;
            auVar25._12_4_ = 0x7fffffff;
            auVar78 = vandps_avx512vl(auVar73,auVar25);
            if (auVar78._0_4_ < auVar254._0_4_) {
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar254._0_4_ + auVar233._0_4_)),local_940,
                                        ZEXT416(0x36000000));
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(ZEXT416((uint)fVar222),auVar26);
              if (auVar72._0_4_ < auVar78._0_4_) {
                bVar66 = uVar63 < 5;
                fVar223 = auVar71._0_4_ + (float)local_950._0_4_;
                if ((fVar145 <= fVar223) &&
                   (fVar202 = *(float *)(ray + k * 4 + 0x200), fVar223 <= fVar202)) {
                  auVar71 = vmovshdup_avx(auVar71);
                  bVar64 = 0;
                  if ((auVar71._0_4_ < 0.0) || (1.0 < auVar71._0_4_)) goto LAB_01a4da22;
                  auVar216._0_12_ = ZEXT812(0);
                  auVar216._12_4_ = 0;
                  auVar136._0_16_ = auVar216;
                  auVar135._4_60_ = auVar136._4_60_;
                  auVar135._0_4_ = fVar219;
                  auVar71 = vrsqrt14ss_avx512f(auVar216,auVar135._0_16_);
                  fVar218 = auVar71._0_4_;
                  auVar69 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
                  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar64 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01a4da22;
                    fVar218 = fVar218 * 1.5 + auVar69._0_4_ * fVar218 * fVar218 * fVar218;
                    auVar196._0_4_ = auVar1._0_4_ * fVar218;
                    auVar196._4_4_ = auVar1._4_4_ * fVar218;
                    auVar196._8_4_ = auVar1._8_4_ * fVar218;
                    auVar196._12_4_ = auVar1._12_4_ * fVar218;
                    auVar78 = vfmadd213ps_fma(auVar74,auVar196,auVar70);
                    auVar69 = vshufps_avx(auVar196,auVar196,0xc9);
                    auVar71 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar197._0_4_ = auVar196._0_4_ * auVar71._0_4_;
                    auVar197._4_4_ = auVar196._4_4_ * auVar71._4_4_;
                    auVar197._8_4_ = auVar196._8_4_ * auVar71._8_4_;
                    auVar197._12_4_ = auVar196._12_4_ * auVar71._12_4_;
                    auVar70 = vfmsub231ps_fma(auVar197,auVar70,auVar69);
                    auVar69 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar71 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                    auVar154._0_4_ = auVar78._0_4_ * auVar70._0_4_;
                    auVar154._4_4_ = auVar78._4_4_ * auVar70._4_4_;
                    auVar154._8_4_ = auVar78._8_4_ * auVar70._8_4_;
                    auVar154._12_4_ = auVar78._12_4_ * auVar70._12_4_;
                    auVar69 = vfmsub231ps_fma(auVar154,auVar69,auVar71);
                    auVar260 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar260,auVar163);
                    auVar163 = vpermps_avx512f(auVar260,ZEXT1664(auVar69));
                    auVar260 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar260,ZEXT1664(auVar69));
                    local_380 = vbroadcastss_avx512f(auVar69);
                    local_400[0] = (RTCHitN)auVar163[0];
                    local_400[1] = (RTCHitN)auVar163[1];
                    local_400[2] = (RTCHitN)auVar163[2];
                    local_400[3] = (RTCHitN)auVar163[3];
                    local_400[4] = (RTCHitN)auVar163[4];
                    local_400[5] = (RTCHitN)auVar163[5];
                    local_400[6] = (RTCHitN)auVar163[6];
                    local_400[7] = (RTCHitN)auVar163[7];
                    local_400[8] = (RTCHitN)auVar163[8];
                    local_400[9] = (RTCHitN)auVar163[9];
                    local_400[10] = (RTCHitN)auVar163[10];
                    local_400[0xb] = (RTCHitN)auVar163[0xb];
                    local_400[0xc] = (RTCHitN)auVar163[0xc];
                    local_400[0xd] = (RTCHitN)auVar163[0xd];
                    local_400[0xe] = (RTCHitN)auVar163[0xe];
                    local_400[0xf] = (RTCHitN)auVar163[0xf];
                    local_400[0x10] = (RTCHitN)auVar163[0x10];
                    local_400[0x11] = (RTCHitN)auVar163[0x11];
                    local_400[0x12] = (RTCHitN)auVar163[0x12];
                    local_400[0x13] = (RTCHitN)auVar163[0x13];
                    local_400[0x14] = (RTCHitN)auVar163[0x14];
                    local_400[0x15] = (RTCHitN)auVar163[0x15];
                    local_400[0x16] = (RTCHitN)auVar163[0x16];
                    local_400[0x17] = (RTCHitN)auVar163[0x17];
                    local_400[0x18] = (RTCHitN)auVar163[0x18];
                    local_400[0x19] = (RTCHitN)auVar163[0x19];
                    local_400[0x1a] = (RTCHitN)auVar163[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar163[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar163[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar163[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar163[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar163[0x1f];
                    local_400[0x20] = (RTCHitN)auVar163[0x20];
                    local_400[0x21] = (RTCHitN)auVar163[0x21];
                    local_400[0x22] = (RTCHitN)auVar163[0x22];
                    local_400[0x23] = (RTCHitN)auVar163[0x23];
                    local_400[0x24] = (RTCHitN)auVar163[0x24];
                    local_400[0x25] = (RTCHitN)auVar163[0x25];
                    local_400[0x26] = (RTCHitN)auVar163[0x26];
                    local_400[0x27] = (RTCHitN)auVar163[0x27];
                    local_400[0x28] = (RTCHitN)auVar163[0x28];
                    local_400[0x29] = (RTCHitN)auVar163[0x29];
                    local_400[0x2a] = (RTCHitN)auVar163[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar163[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar163[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar163[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar163[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar163[0x2f];
                    local_400[0x30] = (RTCHitN)auVar163[0x30];
                    local_400[0x31] = (RTCHitN)auVar163[0x31];
                    local_400[0x32] = (RTCHitN)auVar163[0x32];
                    local_400[0x33] = (RTCHitN)auVar163[0x33];
                    local_400[0x34] = (RTCHitN)auVar163[0x34];
                    local_400[0x35] = (RTCHitN)auVar163[0x35];
                    local_400[0x36] = (RTCHitN)auVar163[0x36];
                    local_400[0x37] = (RTCHitN)auVar163[0x37];
                    local_400[0x38] = (RTCHitN)auVar163[0x38];
                    local_400[0x39] = (RTCHitN)auVar163[0x39];
                    local_400[0x3a] = (RTCHitN)auVar163[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar163[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar163[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar163[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar163[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar163[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar163 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar163);
                    vpcmpeqd_avx2(auVar163._0_32_,auVar163._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar223;
                    auVar163 = vmovdqa64_avx512f(local_500);
                    local_7c0 = vmovdqa64_avx512f(auVar163);
                    local_a70.valid = (int *)local_7c0;
                    local_a70.geometryUserPtr = pGVar3->userPtr;
                    local_a70.context = context->user;
                    local_a70.hit = local_400;
                    local_a70.N = 0x10;
                    local_a70.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar242 = ZEXT1664(auVar240);
                      auVar247 = ZEXT1664(auVar245);
                      auVar251 = ZEXT1664(auVar1);
                      auVar253 = ZEXT1664(auVar152);
                      (*pGVar3->occlusionFilterN)(&local_a70);
                      auVar163 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar14 = vptestmd_avx512f(auVar163,auVar163);
                    if ((short)uVar14 != 0) {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        auVar247 = ZEXT1664(auVar247._0_16_);
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        (*p_Var4)(&local_a70);
                        auVar163 = vmovdqa64_avx512f(local_7c0);
                      }
                      uVar67 = vptestmd_avx512f(auVar163,auVar163);
                      auVar163 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar5 = (bool)((byte)uVar67 & 1);
                      auVar137._0_4_ =
                           (uint)bVar5 * auVar163._0_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x200);
                      bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
                      auVar137._4_4_ =
                           (uint)bVar5 * auVar163._4_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x204);
                      bVar5 = (bool)((byte)(uVar67 >> 2) & 1);
                      auVar137._8_4_ =
                           (uint)bVar5 * auVar163._8_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x208);
                      bVar5 = (bool)((byte)(uVar67 >> 3) & 1);
                      auVar137._12_4_ =
                           (uint)bVar5 * auVar163._12_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x20c);
                      bVar5 = (bool)((byte)(uVar67 >> 4) & 1);
                      auVar137._16_4_ =
                           (uint)bVar5 * auVar163._16_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x210);
                      bVar5 = (bool)((byte)(uVar67 >> 5) & 1);
                      auVar137._20_4_ =
                           (uint)bVar5 * auVar163._20_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x214);
                      bVar5 = (bool)((byte)(uVar67 >> 6) & 1);
                      auVar137._24_4_ =
                           (uint)bVar5 * auVar163._24_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x218);
                      bVar5 = (bool)((byte)(uVar67 >> 7) & 1);
                      auVar137._28_4_ =
                           (uint)bVar5 * auVar163._28_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x21c);
                      bVar5 = (bool)((byte)(uVar67 >> 8) & 1);
                      auVar137._32_4_ =
                           (uint)bVar5 * auVar163._32_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x220);
                      bVar5 = (bool)((byte)(uVar67 >> 9) & 1);
                      auVar137._36_4_ =
                           (uint)bVar5 * auVar163._36_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x224);
                      bVar5 = (bool)((byte)(uVar67 >> 10) & 1);
                      auVar137._40_4_ =
                           (uint)bVar5 * auVar163._40_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x228);
                      bVar5 = (bool)((byte)(uVar67 >> 0xb) & 1);
                      auVar137._44_4_ =
                           (uint)bVar5 * auVar163._44_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x22c);
                      bVar5 = (bool)((byte)(uVar67 >> 0xc) & 1);
                      auVar137._48_4_ =
                           (uint)bVar5 * auVar163._48_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x230);
                      bVar5 = (bool)((byte)(uVar67 >> 0xd) & 1);
                      auVar137._52_4_ =
                           (uint)bVar5 * auVar163._52_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x234);
                      bVar5 = (bool)((byte)(uVar67 >> 0xe) & 1);
                      auVar137._56_4_ =
                           (uint)bVar5 * auVar163._56_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x238);
                      bVar5 = SUB81(uVar67 >> 0xf,0);
                      auVar137._60_4_ =
                           (uint)bVar5 * auVar163._60_4_ |
                           (uint)!bVar5 * *(int *)(local_a70.ray + 0x23c);
                      *(undefined1 (*) [64])(local_a70.ray + 0x200) = auVar137;
                      bVar64 = 1;
                      if ((short)uVar67 != 0) goto LAB_01a4da22;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar202;
                  }
                }
                bVar64 = 0;
                goto LAB_01a4da22;
              }
            }
            uVar63 = uVar63 + 1;
          }
          bVar66 = false;
LAB_01a4da22:
          bVar59 = bVar59 | bVar66 & bVar64;
          uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar232._4_4_ = uVar164;
          auVar232._0_4_ = uVar164;
          auVar232._8_4_ = uVar164;
          auVar232._12_4_ = uVar164;
          auVar232._16_4_ = uVar164;
          auVar232._20_4_ = uVar164;
          auVar232._24_4_ = uVar164;
          auVar232._28_4_ = uVar164;
          auVar163 = ZEXT3264(auVar232);
          auVar54._4_4_ = fStack_73c;
          auVar54._0_4_ = local_740;
          auVar54._8_4_ = fStack_738;
          auVar54._12_4_ = fStack_734;
          auVar54._16_4_ = fStack_730;
          auVar54._20_4_ = fStack_72c;
          auVar54._24_4_ = fStack_728;
          auVar54._28_4_ = fStack_724;
          uVar14 = vcmpps_avx512vl(auVar232,auVar54,0xd);
        }
        uVar16 = vpcmpd_avx512vl(local_700,local_6a0,1);
        uVar15 = vpcmpd_avx512vl(local_700,_local_760,1);
        auVar178._0_4_ = (float)local_820._0_4_ + (float)local_440._0_4_;
        auVar178._4_4_ = (float)local_820._4_4_ + (float)local_440._4_4_;
        auVar178._8_4_ = fStack_818 + fStack_438;
        auVar178._12_4_ = fStack_814 + fStack_434;
        auVar178._16_4_ = fStack_810 + fStack_430;
        auVar178._20_4_ = fStack_80c + fStack_42c;
        auVar178._24_4_ = fStack_808 + fStack_428;
        auVar178._28_4_ = fStack_804 + fStack_424;
        uVar164 = auVar163._0_4_;
        auVar199._4_4_ = uVar164;
        auVar199._0_4_ = uVar164;
        auVar199._8_4_ = uVar164;
        auVar199._12_4_ = uVar164;
        auVar199._16_4_ = uVar164;
        auVar199._20_4_ = uVar164;
        auVar199._24_4_ = uVar164;
        auVar199._28_4_ = uVar164;
        uVar14 = vcmpps_avx512vl(auVar178,auVar199,2);
        bVar61 = bVar61 & (byte)uVar16 & (byte)uVar14;
        auVar217._0_4_ = (float)local_820._0_4_ + (float)local_6e0._0_4_;
        auVar217._4_4_ = (float)local_820._4_4_ + (float)local_6e0._4_4_;
        auVar217._8_4_ = fStack_818 + fStack_6d8;
        auVar217._12_4_ = fStack_814 + fStack_6d4;
        auVar217._16_4_ = fStack_810 + fStack_6d0;
        auVar217._20_4_ = fStack_80c + fStack_6cc;
        auVar217._24_4_ = fStack_808 + fStack_6c8;
        auVar217._28_4_ = fStack_804 + fStack_6c4;
        uVar14 = vcmpps_avx512vl(auVar217,auVar199,2);
        bVar56 = bVar56 & (byte)uVar15 & (byte)uVar14 | bVar61;
        if (bVar56 != 0) {
          abStack_1a0[uVar60 * 0x60] = bVar56;
          bVar66 = (bool)(bVar61 >> 1 & 1);
          bVar5 = (bool)(bVar61 >> 2 & 1);
          bVar6 = (bool)(bVar61 >> 3 & 1);
          bVar7 = (bool)(bVar61 >> 4 & 1);
          bVar8 = (bool)(bVar61 >> 5 & 1);
          auStack_180[uVar60 * 0x18] =
               (uint)(bVar61 & 1) * local_440._0_4_ | (uint)!(bool)(bVar61 & 1) * local_6e0._0_4_;
          auStack_180[uVar60 * 0x18 + 1] =
               (uint)bVar66 * local_440._4_4_ | (uint)!bVar66 * local_6e0._4_4_;
          auStack_180[uVar60 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_438 | (uint)!bVar5 * (int)fStack_6d8;
          auStack_180[uVar60 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_434 | (uint)!bVar6 * (int)fStack_6d4;
          auStack_180[uVar60 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_430 | (uint)!bVar7 * (int)fStack_6d0;
          auStack_180[uVar60 * 0x18 + 5] =
               (uint)bVar8 * (int)fStack_42c | (uint)!bVar8 * (int)fStack_6cc;
          auStack_180[uVar60 * 0x18 + 6] =
               (uint)(bVar61 >> 6) * (int)fStack_428 | (uint)!(bool)(bVar61 >> 6) * (int)fStack_6c8;
          (&fStack_164)[uVar60 * 0x18] = fStack_6c4;
          uVar67 = vmovlps_avx(local_710);
          (&uStack_160)[uVar60 * 0xc] = uVar67;
          aiStack_158[uVar60 * 0x18] = local_d0c + 1;
          uVar60 = (ulong)((int)uVar60 + 1);
        }
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      }
      auVar260 = ZEXT3264(auVar92);
      auVar163 = ZEXT3264(_DAT_01f7b040);
    }
    do {
      uVar68 = (uint)uVar60;
      uVar60 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        if (bVar59 != 0) goto LAB_01a4e01e;
        uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar164;
        auVar34._0_4_ = uVar164;
        auVar34._8_4_ = uVar164;
        auVar34._12_4_ = uVar164;
        auVar34._16_4_ = uVar164;
        auVar34._20_4_ = uVar164;
        auVar34._24_4_ = uVar164;
        auVar34._28_4_ = uVar164;
        uVar14 = vcmpps_avx512vl(local_680,auVar34,2);
        uVar65 = (ulong)((uint)local_908 & (uint)uVar14);
        goto LAB_01a4b5f3;
      }
      auVar92 = *(undefined1 (*) [32])(auStack_180 + uVar60 * 0x18);
      auVar179._0_4_ = auVar92._0_4_ + (float)local_820._0_4_;
      auVar179._4_4_ = auVar92._4_4_ + (float)local_820._4_4_;
      auVar179._8_4_ = auVar92._8_4_ + fStack_818;
      auVar179._12_4_ = auVar92._12_4_ + fStack_814;
      auVar179._16_4_ = auVar92._16_4_ + fStack_810;
      auVar179._20_4_ = auVar92._20_4_ + fStack_80c;
      auVar179._24_4_ = auVar92._24_4_ + fStack_808;
      auVar179._28_4_ = auVar92._28_4_ + fStack_804;
      uVar164 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar33._4_4_ = uVar164;
      auVar33._0_4_ = uVar164;
      auVar33._8_4_ = uVar164;
      auVar33._12_4_ = uVar164;
      auVar33._16_4_ = uVar164;
      auVar33._20_4_ = uVar164;
      auVar33._24_4_ = uVar164;
      auVar33._28_4_ = uVar164;
      uVar14 = vcmpps_avx512vl(auVar179,auVar33,2);
      uVar138 = (uint)uVar14 & (uint)abStack_1a0[uVar60 * 0x60];
    } while (uVar138 == 0);
    uVar67 = (&uStack_160)[uVar60 * 0xc];
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar67;
    auVar200._8_4_ = 0x7f800000;
    auVar200._0_8_ = 0x7f8000007f800000;
    auVar200._12_4_ = 0x7f800000;
    auVar200._16_4_ = 0x7f800000;
    auVar200._20_4_ = 0x7f800000;
    auVar200._24_4_ = 0x7f800000;
    auVar200._28_4_ = 0x7f800000;
    auVar81 = vblendmps_avx512vl(auVar200,auVar92);
    bVar56 = (byte)uVar138;
    auVar131._0_4_ =
         (uint)(bVar56 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar92._0_4_;
    bVar66 = (bool)((byte)(uVar138 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar66 * auVar81._4_4_ | (uint)!bVar66 * (int)auVar92._4_4_;
    bVar66 = (bool)((byte)(uVar138 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar66 * auVar81._8_4_ | (uint)!bVar66 * (int)auVar92._8_4_;
    bVar66 = (bool)((byte)(uVar138 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar66 * auVar81._12_4_ | (uint)!bVar66 * (int)auVar92._12_4_;
    bVar66 = (bool)((byte)(uVar138 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar66 * auVar81._16_4_ | (uint)!bVar66 * (int)auVar92._16_4_;
    bVar66 = (bool)((byte)(uVar138 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar66 * auVar81._20_4_ | (uint)!bVar66 * (int)auVar92._20_4_;
    bVar66 = (bool)((byte)(uVar138 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar66 * auVar81._24_4_ | (uint)!bVar66 * (int)auVar92._24_4_;
    auVar131._28_4_ =
         (uVar138 >> 7) * auVar81._28_4_ | (uint)!SUB41(uVar138 >> 7,0) * (int)auVar92._28_4_;
    auVar92 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar92 = vminps_avx(auVar131,auVar92);
    auVar81 = vshufpd_avx(auVar92,auVar92,5);
    auVar92 = vminps_avx(auVar92,auVar81);
    auVar81 = vpermpd_avx2(auVar92,0x4e);
    auVar92 = vminps_avx(auVar92,auVar81);
    uVar14 = vcmpps_avx512vl(auVar131,auVar92,0);
    bVar62 = (byte)uVar14 & bVar56;
    if (bVar62 != 0) {
      uVar138 = (uint)bVar62;
    }
    uVar139 = 0;
    for (; (uVar138 & 1) == 0; uVar138 = uVar138 >> 1 | 0x80000000) {
      uVar139 = uVar139 + 1;
    }
    local_d0c = aiStack_158[uVar60 * 0x18];
    bVar56 = ~('\x01' << ((byte)uVar139 & 0x1f)) & bVar56;
    abStack_1a0[uVar60 * 0x60] = bVar56;
    if (bVar56 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar164 = (undefined4)uVar67;
    auVar162._4_4_ = uVar164;
    auVar162._0_4_ = uVar164;
    auVar162._8_4_ = uVar164;
    auVar162._12_4_ = uVar164;
    auVar162._16_4_ = uVar164;
    auVar162._20_4_ = uVar164;
    auVar162._24_4_ = uVar164;
    auVar162._28_4_ = uVar164;
    auVar69 = vmovshdup_avx(auVar175);
    auVar69 = vsubps_avx(auVar69,auVar175);
    auVar180._0_4_ = auVar69._0_4_;
    auVar180._4_4_ = auVar180._0_4_;
    auVar180._8_4_ = auVar180._0_4_;
    auVar180._12_4_ = auVar180._0_4_;
    auVar180._16_4_ = auVar180._0_4_;
    auVar180._20_4_ = auVar180._0_4_;
    auVar180._24_4_ = auVar180._0_4_;
    auVar180._28_4_ = auVar180._0_4_;
    auVar69 = vfmadd132ps_fma(auVar180,auVar162,auVar163._0_32_);
    auVar92 = ZEXT1632(auVar69);
    local_400[0] = (RTCHitN)auVar92[0];
    local_400[1] = (RTCHitN)auVar92[1];
    local_400[2] = (RTCHitN)auVar92[2];
    local_400[3] = (RTCHitN)auVar92[3];
    local_400[4] = (RTCHitN)auVar92[4];
    local_400[5] = (RTCHitN)auVar92[5];
    local_400[6] = (RTCHitN)auVar92[6];
    local_400[7] = (RTCHitN)auVar92[7];
    local_400[8] = (RTCHitN)auVar92[8];
    local_400[9] = (RTCHitN)auVar92[9];
    local_400[10] = (RTCHitN)auVar92[10];
    local_400[0xb] = (RTCHitN)auVar92[0xb];
    local_400[0xc] = (RTCHitN)auVar92[0xc];
    local_400[0xd] = (RTCHitN)auVar92[0xd];
    local_400[0xe] = (RTCHitN)auVar92[0xe];
    local_400[0xf] = (RTCHitN)auVar92[0xf];
    local_400[0x10] = (RTCHitN)auVar92[0x10];
    local_400[0x11] = (RTCHitN)auVar92[0x11];
    local_400[0x12] = (RTCHitN)auVar92[0x12];
    local_400[0x13] = (RTCHitN)auVar92[0x13];
    local_400[0x14] = (RTCHitN)auVar92[0x14];
    local_400[0x15] = (RTCHitN)auVar92[0x15];
    local_400[0x16] = (RTCHitN)auVar92[0x16];
    local_400[0x17] = (RTCHitN)auVar92[0x17];
    local_400[0x18] = (RTCHitN)auVar92[0x18];
    local_400[0x19] = (RTCHitN)auVar92[0x19];
    local_400[0x1a] = (RTCHitN)auVar92[0x1a];
    local_400[0x1b] = (RTCHitN)auVar92[0x1b];
    local_400[0x1c] = (RTCHitN)auVar92[0x1c];
    local_400[0x1d] = (RTCHitN)auVar92[0x1d];
    local_400[0x1e] = (RTCHitN)auVar92[0x1e];
    local_400[0x1f] = (RTCHitN)auVar92[0x1f];
    local_710._8_8_ = 0;
    local_710._0_8_ = *(ulong *)(local_400 + (ulong)uVar139 * 4);
    uVar60 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }